

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int64_t iVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  longlong lVar21;
  __m256i alVar22;
  __m256i alVar23;
  __m256i alVar24;
  __m256i alVar25;
  __m256i alVar26;
  __m256i alVar27;
  __m256i alVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  __m256i b;
  __m256i alVar31;
  __m256i alVar32;
  __m256i alVar33;
  __m256i alVar34;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  undefined1 auVar35 [32];
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i alVar36;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [24];
  undefined1 auVar66 [24];
  undefined1 auVar67 [24];
  undefined1 auVar68 [24];
  undefined1 auVar69 [24];
  undefined1 auVar70 [24];
  undefined1 auVar71 [24];
  long lVar72;
  long lVar73;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  __m256i vHL_1;
  __m256i vHS_1;
  __m256i vHM_1;
  __m256i vH_1;
  __m256i vFtL;
  __m256i vFtS;
  __m256i vFtM;
  __m256i vFt;
  __m256i vGapperL_1;
  __m256i vGapper_1;
  __m256i case2;
  __m256i case1;
  __m256i vWS;
  __m256i *pvWS;
  __m256i vWM;
  __m256i *pvWM;
  __m256i vW;
  __m256i *pvW;
  __m256i vHpL;
  __m256i vHpS;
  __m256i vHpM;
  __m256i vHp;
  __m256i vHL;
  __m256i vHS;
  __m256i vHM;
  __m256i vH;
  __m256i vFL;
  __m256i vFS;
  __m256i vFM;
  __m256i vF_opn;
  __m256i vF_ext;
  __m256i vF;
  __m256i vHtL;
  __m256i vHtS;
  __m256i vHtM;
  __m256i vHt;
  __m256i vEL;
  __m256i vES;
  __m256i vEM;
  __m256i vE_opn;
  __m256i vE_ext;
  __m256i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_64_t h;
  int32_t segNum;
  int32_t index;
  __m256i vGapperL;
  __m256i vGapper;
  parasail_result_t *result;
  __m256i vSegLen;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  __m256i vOne;
  __m256i vZero;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  int64_t *boundary;
  __m256i *pvGapperL;
  __m256i *pvGapper;
  __m256i *pvHLMax;
  __m256i *pvHSMax;
  __m256i *pvHMMax;
  __m256i *pvHMax;
  __m256i *pvHL;
  __m256i *pvHS;
  __m256i *pvHM;
  __m256i *pvH;
  __m256i *pvEL;
  __m256i *pvES;
  __m256i *pvEM;
  __m256i *pvE;
  __m256i *pvPs;
  __m256i *pvPm;
  __m256i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int64_t local_24f8;
  size_t in_stack_ffffffffffffdb10;
  long lVar114;
  undefined8 in_stack_ffffffffffffdb20;
  longlong lVar115;
  undefined8 in_stack_ffffffffffffdb28;
  longlong lVar116;
  longlong in_stack_ffffffffffffdb30;
  longlong lVar117;
  longlong lStack_24c8;
  longlong local_24c0;
  longlong lStack_24b8;
  __m256i *in_stack_ffffffffffffdb50;
  longlong lVar118;
  undefined8 in_stack_ffffffffffffdb58;
  undefined8 in_stack_ffffffffffffdb60;
  longlong lVar119;
  undefined8 in_stack_ffffffffffffdb68;
  longlong lVar120;
  longlong in_stack_ffffffffffffdb70;
  longlong lVar121;
  undefined8 in_stack_ffffffffffffdb78;
  undefined8 in_stack_ffffffffffffdb80;
  longlong lVar122;
  undefined8 in_stack_ffffffffffffdb88;
  longlong lVar123;
  longlong in_stack_ffffffffffffdb90;
  longlong lVar124;
  longlong lStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  long local_2400;
  long lStack_23f8;
  long lStack_23f0;
  long lStack_23e8;
  long local_23c0;
  long lStack_23b8;
  long lStack_23b0;
  long lStack_23a8;
  undefined1 local_2380 [16];
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  __m256i local_22a0;
  __m256i local_2280;
  __m256i local_2260;
  __m256i local_2240;
  undefined1 local_2220 [32];
  undefined1 local_2200 [32];
  undefined1 local_21e0 [32];
  long local_21c0;
  long lStack_21b8;
  long lStack_21b0;
  long lStack_21a8;
  undefined1 local_21a0 [32];
  undefined1 local_2180 [32];
  undefined1 local_2160 [32];
  long local_2140;
  long lStack_2138;
  long lStack_2130;
  long lStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined1 local_2100 [32];
  undefined1 local_20e0 [32];
  undefined1 local_20c0 [32];
  undefined1 local_20a0 [32];
  undefined1 local_2080 [32];
  longlong local_2060;
  longlong lStack_2058;
  longlong lStack_2050;
  longlong lStack_2048;
  longlong local_2040;
  longlong lStack_2038;
  longlong lStack_2030;
  longlong lStack_2028;
  longlong local_2020;
  longlong lStack_2018;
  longlong lStack_2010;
  longlong lStack_2008;
  longlong local_2000;
  longlong lStack_1ff8;
  longlong lStack_1ff0;
  longlong lStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  longlong local_1f80 [7];
  int local_1f48;
  int local_1f44;
  undefined1 local_1f40 [32];
  undefined1 local_1f20 [32];
  parasail_result_t *local_1ee8;
  undefined1 local_1ee0 [32];
  undefined1 local_1ec0 [32];
  ulong local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  longlong local_1e00;
  longlong local_1df8;
  longlong local_1df0;
  ulong local_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  ulong local_1d90;
  ulong local_1d88;
  undefined1 local_1d80 [16];
  undefined1 auStack_1d70 [16];
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  int64_t *local_1d40;
  __m256i *local_1d38;
  __m256i *local_1d30;
  __m256i *local_1d28;
  __m256i *local_1d20;
  __m256i *local_1d18;
  __m256i *local_1d10;
  __m256i *local_1d08;
  __m256i *local_1d00;
  __m256i *local_1cf8;
  __m256i *local_1cf0;
  __m256i *local_1ce8;
  __m256i *local_1ce0;
  __m256i *local_1cd8;
  __m256i *local_1cd0;
  long local_1cc8;
  long local_1cc0;
  long local_1cb8;
  int local_1cb0;
  int local_1cac;
  int local_1ca8;
  int local_1ca4;
  long local_1ca0;
  int local_1c94;
  int local_1c90;
  int local_1c8c;
  int local_1c88;
  int local_1c84;
  int local_1c80;
  int local_1c7c;
  int local_1c78;
  int local_1c74;
  long local_1c70;
  parasail_result_t *local_1c60;
  ulong local_1c58;
  ulong local_1c50;
  ulong local_1c48;
  ulong local_1c40;
  ulong local_1c38;
  ulong local_1c30;
  ulong local_1c28;
  ulong local_1c20;
  undefined8 local_1c18;
  ulong local_1c10;
  ulong local_1c08;
  undefined1 local_1c00 [32];
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  ulong local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  longlong local_1ae0;
  longlong lStack_1ad8;
  longlong lStack_1ad0;
  longlong lStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  longlong lStack_1a88;
  int64_t local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  longlong local_1a40;
  longlong lStack_1a38;
  longlong lStack_1a30;
  longlong lStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  longlong local_1a00;
  longlong lStack_19f8;
  longlong lStack_19f0;
  longlong lStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  longlong local_19c0;
  longlong lStack_19b8;
  longlong lStack_19b0;
  longlong lStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  longlong local_1980;
  longlong lStack_1978;
  longlong lStack_1970;
  longlong lStack_1968;
  longlong local_1960;
  longlong lStack_1958;
  longlong lStack_1950;
  longlong lStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  longlong lStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  longlong local_1880;
  longlong lStack_1878;
  longlong lStack_1870;
  longlong lStack_1868;
  undefined1 local_1860 [32];
  ulong local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined1 local_1820 [16];
  undefined1 auStack_1810 [16];
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  long local_17c0;
  long lStack_17b8;
  long lStack_17b0;
  long lStack_17a8;
  undefined1 local_17a0 [16];
  undefined1 auStack_1790 [16];
  longlong local_1780;
  longlong lStack_1778;
  longlong lStack_1770;
  longlong lStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  longlong local_1740;
  longlong lStack_1738;
  longlong lStack_1730;
  longlong lStack_1728;
  longlong local_1720;
  longlong lStack_1718;
  longlong lStack_1710;
  longlong lStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined1 local_16e0 [16];
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  longlong local_16c0;
  longlong lStack_16b8;
  longlong lStack_16b0;
  longlong lStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  longlong local_1660;
  longlong lStack_1658;
  longlong lStack_1650;
  longlong lStack_1648;
  __m256i *local_1628;
  longlong local_1620;
  longlong lStack_1618;
  longlong lStack_1610;
  longlong lStack_1608;
  __m256i *local_15e8;
  longlong local_15e0;
  longlong lStack_15d8;
  longlong lStack_15d0;
  longlong lStack_15c8;
  __m256i *local_15a8;
  long local_15a0;
  long lStack_1598;
  long lStack_1590;
  long lStack_1588;
  __m256i *local_1568;
  longlong local_1560;
  longlong lStack_1558;
  longlong lStack_1550;
  longlong lStack_1548;
  __m256i *local_1528;
  longlong local_1520;
  longlong lStack_1518;
  longlong lStack_1510;
  longlong lStack_1508;
  __m256i *local_14e8;
  longlong local_14e0;
  longlong lStack_14d8;
  longlong lStack_14d0;
  longlong lStack_14c8;
  __m256i *local_14a8;
  longlong local_14a0;
  longlong lStack_1498;
  longlong lStack_1490;
  longlong lStack_1488;
  __m256i *local_1468;
  longlong local_1460;
  longlong lStack_1458;
  longlong lStack_1450;
  longlong lStack_1448;
  __m256i *local_1428;
  longlong local_1420;
  longlong lStack_1418;
  longlong lStack_1410;
  longlong lStack_1408;
  __m256i *local_13e8;
  longlong local_13e0;
  longlong lStack_13d8;
  longlong lStack_13d0;
  longlong lStack_13c8;
  __m256i *local_13a8;
  longlong local_13a0;
  longlong lStack_1398;
  longlong lStack_1390;
  longlong lStack_1388;
  __m256i *local_1368;
  __m256i *local_1328;
  longlong local_1320;
  longlong lStack_1318;
  longlong lStack_1310;
  longlong lStack_1308;
  __m256i *local_12e8;
  longlong local_12e0;
  longlong lStack_12d8;
  longlong lStack_12d0;
  longlong lStack_12c8;
  __m256i *local_12c0;
  __m256i *local_12b8;
  __m256i *local_12b0;
  __m256i *local_12a8;
  __m256i *local_12a0;
  __m256i *local_1298;
  __m256i *local_1290;
  __m256i *local_1288;
  __m256i *local_1280;
  __m256i *local_1278;
  __m256i *local_1270;
  __m256i *local_1268;
  __m256i *local_1260;
  __m256i *local_1258;
  __m256i *local_1250;
  __m256i *local_1248;
  __m256i *local_1240;
  undefined1 (*local_1238) [32];
  undefined1 (*local_1230) [32];
  undefined1 (*local_1228) [32];
  __m256i *local_1220;
  __m256i *local_1218;
  __m256i *local_1210;
  __m256i *local_1208;
  __m256i *local_1200;
  __m256i *local_11f8;
  __m256i *local_11f0;
  __m256i *local_11e8;
  __m256i *local_11e0;
  __m256i *local_11d8;
  __m256i *local_11d0;
  __m256i *local_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  long local_1120;
  long lStack_1118;
  long lStack_1110;
  long lStack_1108;
  int64_t local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  long local_10e0;
  long lStack_10d8;
  long lStack_10d0;
  long lStack_10c8;
  long local_10c0;
  long lStack_10b8;
  long lStack_10b0;
  long lStack_10a8;
  long local_10a0;
  long lStack_1098;
  long lStack_1090;
  long lStack_1088;
  long local_1080;
  long lStack_1078;
  long lStack_1070;
  long lStack_1068;
  long local_1060;
  long lStack_1058;
  long lStack_1050;
  long lStack_1048;
  longlong local_1040;
  longlong lStack_1038;
  longlong lStack_1030;
  longlong lStack_1028;
  longlong local_1020;
  longlong lStack_1018;
  longlong lStack_1010;
  longlong lStack_1008;
  long local_1000;
  long lStack_ff8;
  long lStack_ff0;
  long lStack_fe8;
  long local_fe0;
  long lStack_fd8;
  long lStack_fd0;
  long lStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  longlong local_fa0;
  longlong lStack_f98;
  longlong lStack_f90;
  longlong lStack_f88;
  long local_f80;
  long lStack_f78;
  long lStack_f70;
  long lStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  longlong lStack_f48;
  undefined1 local_f40 [32];
  long local_f20;
  long lStack_f18;
  long lStack_f10;
  long lStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  longlong lStack_ec8;
  long local_ec0;
  long lStack_eb8;
  long lStack_eb0;
  long lStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  longlong lStack_e88;
  undefined1 local_e80 [32];
  long local_e60;
  long lStack_e58;
  long lStack_e50;
  long lStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  longlong lStack_e08;
  long local_e00;
  long lStack_df8;
  long lStack_df0;
  long lStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  longlong lStack_dc8;
  undefined1 local_dc0 [32];
  long local_da0;
  long lStack_d98;
  long lStack_d90;
  long lStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  longlong lStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined1 local_ae0 [32];
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  longlong local_8a0;
  longlong lStack_898;
  longlong lStack_890;
  longlong lStack_888;
  longlong local_880;
  longlong lStack_878;
  longlong lStack_870;
  longlong lStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  longlong local_840;
  longlong lStack_838;
  longlong lStack_830;
  longlong lStack_828;
  longlong local_820;
  longlong lStack_818;
  longlong lStack_810;
  longlong lStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  longlong local_7e0;
  longlong lStack_7d8;
  longlong lStack_7d0;
  longlong lStack_7c8;
  longlong local_7c0;
  longlong lStack_7b8;
  longlong lStack_7b0;
  longlong lStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_760 [32];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  longlong lStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  longlong lStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  longlong lStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  longlong lStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  longlong lStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  longlong lStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  long local_520;
  long lStack_518;
  long lStack_510;
  long lStack_508;
  undefined1 local_500 [32];
  long local_4e0;
  long lStack_4d8;
  long lStack_4d0;
  long lStack_4c8;
  undefined1 local_4c0 [32];
  long local_4a0;
  long lStack_498;
  long lStack_490;
  long lStack_488;
  undefined1 local_480 [32];
  long local_460;
  long lStack_458;
  long lStack_450;
  long lStack_448;
  long local_440;
  long lStack_438;
  long lStack_430;
  long lStack_428;
  long local_420;
  long lStack_418;
  long lStack_410;
  long lStack_408;
  long local_400;
  long lStack_3f8;
  long lStack_3f0;
  long lStack_3e8;
  long local_3e0;
  long lStack_3d8;
  long lStack_3d0;
  long lStack_3c8;
  long local_3c0;
  long lStack_3b8;
  long lStack_3b0;
  long lStack_3a8;
  long local_3a0;
  long lStack_398;
  long lStack_390;
  long lStack_388;
  long local_380;
  long lStack_378;
  long lStack_370;
  long lStack_368;
  long local_360;
  long lStack_358;
  long lStack_350;
  long lStack_348;
  long local_340;
  long lStack_338;
  long lStack_330;
  long lStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  undefined1 local_2c0 [32];
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  ulong local_220;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_1c80 = 0;
  local_1c84 = 0;
  local_1c88 = 0;
  local_1c8c = 0;
  local_1c90 = 0;
  local_1c94 = 0;
  local_1ca0 = 0;
  local_1ca4 = 0;
  local_1ca8 = 0;
  local_1cac = 0;
  local_1cb0 = 0;
  local_1cb8 = 0;
  local_1cc0 = 0;
  local_1cc8 = 0;
  local_1cd0 = (__m256i *)0x0;
  local_1cd8 = (__m256i *)0x0;
  local_1ce0 = (__m256i *)0x0;
  local_1ce8 = (__m256i *)0x0;
  local_1cf0 = (__m256i *)0x0;
  local_1cf8 = (__m256i *)0x0;
  local_1d00 = (__m256i *)0x0;
  local_1d08 = (__m256i *)0x0;
  local_1d10 = (__m256i *)0x0;
  local_1d18 = (__m256i *)0x0;
  local_1d20 = (__m256i *)0x0;
  local_1d28 = (__m256i *)0x0;
  local_1d30 = (__m256i *)0x0;
  local_1d38 = (__m256i *)0x0;
  local_1d40 = (int64_t *)0x0;
  local_1d88 = 0;
  local_1d90 = 0;
  local_1de8 = 0;
  local_1df0 = 0;
  local_1df8 = 0;
  local_1e00 = 0;
  local_1ee8 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_avx2_256_64","profile");
    local_1c60 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x60) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_avx2_256_64",
            "profile->profile64.score");
    local_1c60 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_avx2_256_64",
            "profile->matrix");
    local_1c60 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_scan_profile_avx2_256_64",
            "profile->s1Len");
    local_1c60 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_avx2_256_64","s2");
    local_1c60 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_scan_profile_avx2_256_64","s2Len");
    local_1c60 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_scan_profile_avx2_256_64","open");
    local_1c60 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_scan_profile_avx2_256_64","gap");
    local_1c60 = (parasail_result_t *)0x0;
  }
  else {
    local_1c80 = 0;
    local_1c84 = 0;
    local_1c88 = 0;
    local_1c8c = *(int *)(in_RDI + 8);
    local_1c90 = local_1c8c + -1;
    local_1c94 = in_EDX + -1;
    local_1ca0 = *(long *)(in_RDI + 0x10);
    local_1ca4 = 4;
    local_1ca8 = (local_1c8c + 3) / 4;
    local_1cac = (local_1c8c + -1) % local_1ca8;
    local_1cb0 = ~((local_1c8c + -1) / local_1ca8) + 4;
    local_1cb8 = *(long *)(in_RDI + 0x60);
    local_1cc0 = *(long *)(in_RDI + 0x68);
    local_1cc8 = *(long *)(in_RDI + 0x70);
    local_1c08 = (ulong)in_ECX;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_1c08;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = local_1c08;
    local_300 = vpunpcklqdq_avx(auVar74,auVar81);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = local_1c08;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = local_1c08;
    auStack_2f0 = vpunpcklqdq_avx(auVar82,auVar92);
    local_1d60 = local_300._0_8_;
    uStack_1d58 = local_300._8_8_;
    uStack_1d50 = auStack_2f0._0_8_;
    uStack_1d48 = auStack_2f0._8_8_;
    local_1c10 = (ulong)in_R8D;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_1c10;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = local_1c10;
    auVar74 = vpunpcklqdq_avx(auVar75,auVar83);
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_1c10;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = local_1c10;
    auVar75 = vpunpcklqdq_avx(auVar76,auVar93);
    local_2c0._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar75;
    local_2c0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar74;
    if (-in_ECX < *(int *)(local_1ca0 + 0x20)) {
      lVar72 = (long)in_ECX;
    }
    else {
      lVar72 = -(long)*(int *)(local_1ca0 + 0x20);
    }
    lVar114 = lVar72 + -0x8000000000000000;
    local_1ea0 = lVar72 + 0x8000000000000001;
    local_1d90 = 0x7ffffffffffffffe - (long)*(int *)(local_1ca0 + 0x1c);
    local_1c00._8_8_ = SUB328(ZEXT832(0),4);
    local_1dc0 = 0;
    uStack_1db8 = local_1c00._8_8_;
    uStack_1db0 = 0;
    uStack_1da8 = 0;
    local_1c18 = 1;
    local_248 = 1;
    local_250 = 1;
    local_258 = 1;
    local_260 = 1;
    local_280 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    auStack_270 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    local_1de0 = local_280._0_8_;
    uStack_1dd8 = local_280._8_8_;
    uStack_1dd0 = auStack_270._0_8_;
    uStack_1dc8 = auStack_270._8_8_;
    local_1df0 = 0;
    local_1df8 = 0;
    local_1e00 = 0;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_1ea0;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = local_1ea0;
    local_240 = vpunpcklqdq_avx(auVar77,auVar84);
    auVar85._8_8_ = 0;
    auVar85._0_8_ = local_1ea0;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = local_1ea0;
    auStack_230 = vpunpcklqdq_avx(auVar85,auVar94);
    local_1e20 = local_240._0_8_;
    uStack_1e18 = local_240._8_8_;
    uStack_1e10 = auStack_230._0_8_;
    uStack_1e08 = auStack_230._8_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = local_1d90;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = local_1d90;
    local_200 = vpunpcklqdq_avx(auVar78,auVar86);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = local_1d90;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = local_1d90;
    auStack_1f0 = vpunpcklqdq_avx(auVar87,auVar95);
    local_1e40 = local_200._0_8_;
    uStack_1e38 = local_200._8_8_;
    uStack_1e30 = auStack_1f0._0_8_;
    uStack_1e28 = auStack_1f0._8_8_;
    local_1e60 = local_200._0_8_;
    uStack_1e58 = local_200._8_8_;
    uStack_1e50 = auStack_1f0._0_8_;
    uStack_1e48 = auStack_1f0._8_8_;
    local_1e80 = local_240._0_8_;
    uStack_1e78 = local_240._8_8_;
    uStack_1e70 = auStack_230._0_8_;
    uStack_1e68 = auStack_230._8_8_;
    uStack_1e98 = local_1c00._8_8_;
    uStack_1e90 = 0;
    uStack_1e88 = 0;
    local_1c30 = (ulong)local_1ca8;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_1c30;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = local_1c30;
    local_1c0 = vpunpcklqdq_avx(auVar79,auVar88);
    auVar89._8_8_ = 0;
    auVar89._0_8_ = local_1c30;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = local_1c30;
    auStack_1b0 = vpunpcklqdq_avx(auVar89,auVar96);
    auVar8._16_16_ = auStack_1b0;
    auVar8._0_16_ = local_1c0;
    local_1c38 = (ulong)local_1ca8;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = local_1c38;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = local_1c38;
    local_180 = vpunpcklqdq_avx(auVar90,auVar97);
    auVar98._8_8_ = 0;
    auVar98._0_8_ = local_1c38;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = local_1c38;
    auStack_170 = vpunpcklqdq_avx(auVar98,auVar103);
    auVar7._16_16_ = auStack_170;
    auVar7._0_16_ = local_180;
    local_1c40 = (ulong)local_1ca8;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = local_1c40;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = local_1c40;
    local_140 = vpunpcklqdq_avx(auVar91,auVar104);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = local_1c40;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = local_1c40;
    local_130 = vpunpcklqdq_avx(auVar105,auVar109);
    auVar7 = vperm2i128_avx2(ZEXT1632(local_140),auVar7,0x28);
    local_1ee0 = vpalignr_avx2(auVar8,auVar7,8);
    local_1c48 = (ulong)(-local_1ca8 * in_R8D);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = local_1c48;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = local_1c48;
    local_100 = vpunpcklqdq_avx(auVar80,auVar99);
    auVar100._8_8_ = 0;
    auVar100._0_8_ = local_1c48;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = local_1c48;
    auStack_f0 = vpunpcklqdq_avx(auVar100,auVar106);
    auVar2._16_16_ = auStack_f0;
    auVar2._0_16_ = local_100;
    local_1c50 = (ulong)(-local_1ca8 * in_R8D);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = local_1c50;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = local_1c50;
    local_c0 = vpunpcklqdq_avx(auVar101,auVar107);
    auVar108._8_8_ = 0;
    auVar108._0_8_ = local_1c50;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = local_1c50;
    auStack_b0 = vpunpcklqdq_avx(auVar108,auVar110);
    auVar3._16_16_ = auStack_b0;
    auVar3._0_16_ = local_c0;
    local_1c58 = (ulong)(-local_1ca8 * in_R8D);
    auVar102._8_8_ = 0;
    auVar102._0_8_ = local_1c58;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = local_1c58;
    local_80 = vpunpcklqdq_avx(auVar102,auVar111);
    auVar112._8_8_ = 0;
    auVar112._0_8_ = local_1c58;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = local_1c58;
    local_70 = vpunpcklqdq_avx(auVar112,auVar113);
    auVar7 = vperm2i128_avx2(ZEXT1632(local_80),auVar3,0x28);
    local_1860 = vpalignr_avx2(auVar2,auVar7,8);
    uStack_1838 = local_1c00._8_8_;
    uStack_1830 = 0;
    uStack_1828 = 0;
    local_1ec0 = vpaddq_avx2(ZEXT1632(CONCAT88(local_1c00._8_8_,local_1ea0)),local_1860);
    local_1de8 = local_1ea0;
    local_1d88 = local_1ea0;
    local_1c7c = in_R8D;
    local_1c78 = in_ECX;
    local_1c74 = in_EDX;
    local_1c70 = in_RSI;
    local_1c28 = local_1d90;
    local_1c20 = local_1ea0;
    local_1c00 = ZEXT832(0) << 0x20;
    local_1840 = local_1ea0;
    local_2e0 = local_1c08;
    local_2d8 = local_1c08;
    local_2d0 = local_1c08;
    local_2c8 = local_1c08;
    local_2a0 = local_1c10;
    local_298 = local_1c10;
    local_290 = local_1c10;
    local_288 = local_1c10;
    local_220 = local_1ea0;
    local_218 = local_1ea0;
    local_210 = local_1ea0;
    local_208 = local_1ea0;
    local_1e0 = local_1d90;
    local_1d8 = local_1d90;
    local_1d0 = local_1d90;
    local_1c8 = local_1d90;
    local_1a0 = local_1c30;
    local_198 = local_1c30;
    local_190 = local_1c30;
    local_188 = local_1c30;
    local_160 = local_1c38;
    local_158 = local_1c38;
    local_150 = local_1c38;
    local_148 = local_1c38;
    local_120 = local_1c40;
    local_118 = local_1c40;
    local_110 = local_1c40;
    local_108 = local_1c40;
    local_e0 = local_1c48;
    local_d8 = local_1c48;
    local_d0 = local_1c48;
    local_c8 = local_1c48;
    local_a0 = local_1c50;
    local_98 = local_1c50;
    local_90 = local_1c50;
    local_88 = local_1c50;
    local_50 = local_1c58;
    local_48 = local_1c58;
    local_40 = local_1c58;
    local_38 = local_1c58;
    local_1d80 = local_2c0._0_16_;
    auStack_1d70 = local_2c0._16_16_;
    local_1ee8 = parasail_result_new_stats();
    if (local_1ee8 == (parasail_result_t *)0x0) {
      local_1c60 = (parasail_result_t *)0x0;
    }
    else {
      local_1ee8->flag = local_1ee8->flag | 0x4810401;
      local_1cd0 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1cd8 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1ce0 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1ce8 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1cf0 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1cf8 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1d00 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1d08 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1d10 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1d18 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1d20 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1d28 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1d30 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1d38 = parasail_memalign___m256i(0x20,(long)local_1ca8);
      local_1d40 = parasail_memalign_int64_t(0x20,(long)(local_1c74 + 1));
      if (local_1cd0 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1cd8 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1ce0 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1ce8 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1cf0 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1cf8 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1d00 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1d08 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1d10 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1d18 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1d20 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1d28 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1d30 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1d38 == (__m256i *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else if (local_1d40 == (int64_t *)0x0) {
        local_1c60 = (parasail_result_t *)0x0;
      }
      else {
        alVar22[1] = in_stack_ffffffffffffdb20;
        alVar22[0] = lVar114;
        alVar22[2] = in_stack_ffffffffffffdb28;
        alVar22[3] = in_stack_ffffffffffffdb30;
        parasail_memset___m256i(in_stack_ffffffffffffdb50,alVar22,in_stack_ffffffffffffdb10);
        alVar23[1] = in_stack_ffffffffffffdb20;
        alVar23[0] = lVar114;
        alVar23[2] = in_stack_ffffffffffffdb28;
        alVar23[3] = in_stack_ffffffffffffdb30;
        parasail_memset___m256i(in_stack_ffffffffffffdb50,alVar23,in_stack_ffffffffffffdb10);
        alVar24[1] = in_stack_ffffffffffffdb20;
        alVar24[0] = lVar114;
        alVar24[2] = in_stack_ffffffffffffdb28;
        alVar24[3] = in_stack_ffffffffffffdb30;
        parasail_memset___m256i(in_stack_ffffffffffffdb50,alVar24,in_stack_ffffffffffffdb10);
        alVar25[1] = in_stack_ffffffffffffdb20;
        alVar25[0] = lVar114;
        alVar25[2] = in_stack_ffffffffffffdb28;
        alVar25[3] = in_stack_ffffffffffffdb30;
        parasail_memset___m256i(in_stack_ffffffffffffdb50,alVar25,in_stack_ffffffffffffdb10);
        alVar26[1] = in_stack_ffffffffffffdb20;
        alVar26[0] = lVar114;
        alVar26[2] = in_stack_ffffffffffffdb28;
        alVar26[3] = in_stack_ffffffffffffdb30;
        parasail_memset___m256i(in_stack_ffffffffffffdb50,alVar26,in_stack_ffffffffffffdb10);
        alVar27[1] = in_stack_ffffffffffffdb20;
        alVar27[0] = lVar114;
        alVar27[2] = in_stack_ffffffffffffdb28;
        alVar27[3] = in_stack_ffffffffffffdb30;
        parasail_memset___m256i(in_stack_ffffffffffffdb50,alVar27,in_stack_ffffffffffffdb10);
        alVar28[1] = in_stack_ffffffffffffdb20;
        alVar28[0] = lVar114;
        alVar28[2] = in_stack_ffffffffffffdb28;
        alVar28[3] = in_stack_ffffffffffffdb30;
        parasail_memset___m256i(in_stack_ffffffffffffdb50,alVar28,in_stack_ffffffffffffdb10);
        local_1680 = local_1dc0;
        uStack_1678 = uStack_1db8;
        uStack_1670 = uStack_1db0;
        uStack_1668 = uStack_1da8;
        local_16a0 = local_1d60;
        uStack_1698 = uStack_1d58;
        uStack_1690 = uStack_1d50;
        uStack_1688 = uStack_1d48;
        auVar5._8_8_ = uStack_1db8;
        auVar5._0_8_ = local_1dc0;
        auVar5._16_8_ = uStack_1db0;
        auVar5._24_8_ = uStack_1da8;
        auVar4._8_8_ = uStack_1d58;
        auVar4._0_8_ = local_1d60;
        auVar4._16_8_ = uStack_1d50;
        auVar4._24_8_ = uStack_1d48;
        local_1f20 = vpsubq_avx2(auVar5,auVar4);
        local_1f40._8_8_ = uStack_1dd8;
        local_1f40._0_8_ = local_1de0;
        local_1f40._16_8_ = uStack_1dd0;
        local_1f40._24_8_ = uStack_1dc8;
        local_1c80 = local_1ca8;
        while (local_1c80 = local_1c80 + -1, -1 < local_1c80) {
          local_12c0 = local_1d30 + local_1c80;
          local_12e0 = local_1f20._0_8_;
          lStack_12d8 = local_1f20._8_8_;
          lStack_12d0 = local_1f20._16_8_;
          lStack_12c8 = local_1f20._24_8_;
          (*local_12c0)[0] = local_1f20._0_8_;
          (*local_12c0)[1] = local_1f20._8_8_;
          (*local_12c0)[2] = local_1f20._16_8_;
          (*local_12c0)[3] = local_1f20._24_8_;
          local_12e8 = local_1d38 + local_1c80;
          local_1320 = local_1f40._0_8_;
          lStack_1318 = local_1f40._8_8_;
          lStack_1310 = local_1f40._16_8_;
          lStack_1308 = local_1f40._24_8_;
          (*local_12e8)[0] = local_1f40._0_8_;
          (*local_12e8)[1] = local_1f40._8_8_;
          (*local_12e8)[2] = local_1f40._16_8_;
          (*local_12e8)[3] = local_1f40._24_8_;
          local_16c0 = local_1f20._0_8_;
          lStack_16b8 = local_1f20._8_8_;
          lStack_16b0 = local_1f20._16_8_;
          lStack_16a8 = local_1f20._24_8_;
          uStack_16d0 = auStack_1d70._0_8_;
          uStack_16c8 = auStack_1d70._8_8_;
          auVar49._16_8_ = auStack_1d70._0_8_;
          auVar49._0_16_ = local_1d80;
          auVar49._24_8_ = auStack_1d70._8_8_;
          local_1f20 = vpsubq_avx2(local_1f20,auVar49);
          local_1880 = local_1f40._0_8_;
          lStack_1878 = local_1f40._8_8_;
          lStack_1870 = local_1f40._16_8_;
          lStack_1868 = local_1f40._24_8_;
          local_18a0 = local_1de0;
          uStack_1898 = uStack_1dd8;
          uStack_1890 = uStack_1dd0;
          uStack_1888 = uStack_1dc8;
          auVar6._8_8_ = uStack_1dd8;
          auVar6._0_8_ = local_1de0;
          auVar6._16_8_ = uStack_1dd0;
          auVar6._24_8_ = uStack_1dc8;
          local_1f40 = vpaddq_avx2(local_1f40,auVar6);
          local_16e0 = local_1d80;
        }
        local_1f44 = 0;
        local_1c80 = 0;
        while( true ) {
          if (local_1ca8 <= local_1c80) break;
          for (local_1f48 = 0; local_1f48 < local_1ca4; local_1f48 = local_1f48 + 1) {
            lVar72 = (long)(-(local_1c7c * (local_1f48 * local_1ca8 + local_1c80)) - local_1c78);
            if (lVar72 < -0x8000000000000000) {
              lVar72 = -0x8000000000000000;
            }
            local_1f80[local_1f48] = lVar72;
          }
          local_1328 = local_1cf0 + local_1f44;
          (*local_1328)[0] = local_1f80[0];
          (*local_1328)[1] = local_1f80[1];
          (*local_1328)[2] = local_1f80[2];
          (*local_1328)[3] = local_1f80[3];
          local_1f44 = local_1f44 + 1;
          local_1c80 = local_1c80 + 1;
        }
        *local_1d40 = 0;
        for (local_1c80 = 1; local_1c80 <= local_1c74; local_1c80 = local_1c80 + 1) {
          local_24f8 = (int64_t)(-(local_1c7c * (local_1c80 + -1)) - local_1c78);
          if (local_24f8 < -0x8000000000000000) {
            local_24f8 = -0x8000000000000000;
          }
          local_1d40[local_1c80] = local_24f8;
        }
        for (local_1c84 = 0; local_1c84 < local_1c74; local_1c84 = local_1c84 + 1) {
          local_11c8 = local_1cf0 + (local_1ca8 + -1);
          local_11d0 = local_1cf8 + (local_1ca8 + -1);
          local_11d8 = local_1d00 + (local_1ca8 + -1);
          local_11e0 = local_1d08 + (local_1ca8 + -1);
          auVar74 = ZEXT816(0) << 0x40;
          auVar7 = vpermq_avx2((undefined1  [32])*local_11c8,0x90);
          auVar7 = vpblendd_avx2(auVar7,ZEXT1632(auVar74),3);
          auVar8 = vpermq_avx2((undefined1  [32])*local_11d0,0x90);
          local_2260 = (__m256i)vpblendd_avx2(auVar8,ZEXT1632(auVar74),3);
          auVar8 = vpermq_avx2((undefined1  [32])*local_11d8,0x90);
          local_2280 = (__m256i)vpblendd_avx2(auVar8,ZEXT1632(auVar74),3);
          auVar8 = vpermq_avx2((undefined1  [32])*local_11e0,0x90);
          local_22a0 = (__m256i)vpblendd_avx2(auVar8,ZEXT1632(auVar74),3);
          local_2240 = (__m256i)vpblendd_avx2(auVar7,ZEXT832((ulong)local_1d40[local_1c84]),3);
          lVar72 = local_1cb8 +
                   (long)(*(int *)(*(long *)(local_1ca0 + 0x10) +
                                  (ulong)*(byte *)(local_1c70 + local_1c84) * 4) * local_1ca8) *
                   0x20;
          lVar114 = local_1cc0 +
                    (long)(*(int *)(*(long *)(local_1ca0 + 0x10) +
                                   (ulong)*(byte *)(local_1c70 + local_1c84) * 4) * local_1ca8) *
                    0x20;
          lVar73 = local_1cc8 +
                   (long)(*(int *)(*(long *)(local_1ca0 + 0x10) +
                                  (ulong)*(byte *)(local_1c70 + local_1c84) * 4) * local_1ca8) *
                   0x20;
          local_1720 = (*local_1d30)[0];
          lStack_1718 = (*local_1d30)[1];
          lStack_1710 = (*local_1d30)[2];
          lStack_1708 = (*local_1d30)[3];
          local_1700 = local_1e20;
          uStack_16f8 = uStack_1e18;
          uStack_16f0 = uStack_1e10;
          uStack_16e8 = uStack_1e08;
          auVar48._8_8_ = uStack_1e18;
          auVar48._0_8_ = local_1e20;
          auVar48._16_8_ = uStack_1e10;
          auVar48._24_8_ = uStack_1e08;
          local_2080 = vpsubq_avx2(auVar48,(undefined1  [32])*local_1d30);
          local_2100._8_8_ = uStack_1e18;
          local_2100._0_8_ = local_1e20;
          local_2100._16_8_ = uStack_1e10;
          local_2100._24_8_ = uStack_1e08;
          local_2160._8_8_ = uStack_1db8;
          local_2160._0_8_ = local_1dc0;
          local_2160._16_8_ = uStack_1db0;
          local_2160._24_8_ = uStack_1da8;
          local_2180._8_8_ = uStack_1db8;
          local_2180._0_8_ = local_1dc0;
          local_2180._16_8_ = uStack_1db0;
          local_2180._24_8_ = uStack_1da8;
          local_21a0._8_8_ = uStack_1db8;
          local_21a0._0_8_ = local_1dc0;
          local_21a0._16_8_ = uStack_1db0;
          local_21a0._24_8_ = uStack_1da8;
          local_1c80 = 0;
          while( true ) {
            if (local_1ca8 <= local_1c80) break;
            local_11e8 = local_1cf0 + local_1c80;
            local_1740 = (*local_11e8)[0];
            lStack_1738 = (*local_11e8)[1];
            lStack_1730 = (*local_11e8)[2];
            lStack_1728 = (*local_11e8)[3];
            alVar23 = *local_11e8;
            local_11f0 = local_1cf8 + local_1c80;
            auVar65 = *(undefined1 (*) [24])*local_11f0;
            lVar122 = (*local_11f0)[3];
            alVar33 = *local_11f0;
            alVar25 = *local_11f0;
            local_11f8 = local_1d00 + local_1c80;
            auVar66 = *(undefined1 (*) [24])*local_11f8;
            lVar123 = (*local_11f8)[3];
            alVar36 = *local_11f8;
            alVar27 = *local_11f8;
            local_1200 = local_1d08 + local_1c80;
            auVar67 = *(undefined1 (*) [24])*local_1200;
            lVar124 = (*local_1200)[3];
            alVar34 = *local_1200;
            alVar31 = *local_1200;
            local_1208 = local_1cd0 + local_1c80;
            local_1780 = (*local_1208)[0];
            lStack_1778 = (*local_1208)[1];
            lStack_1770 = (*local_1208)[2];
            lStack_1768 = (*local_1208)[3];
            local_1210 = local_1cd8 + local_1c80;
            auVar68 = *(undefined1 (*) [24])*local_1210;
            lVar119 = (*local_1210)[3];
            alVar24 = *local_1210;
            local_1218 = local_1ce0 + local_1c80;
            auVar69 = *(undefined1 (*) [24])*local_1218;
            lVar120 = (*local_1218)[3];
            alVar26 = *local_1218;
            local_1220 = local_1ce8 + local_1c80;
            auVar70 = *(undefined1 (*) [24])*local_1220;
            lVar121 = (*local_1220)[3];
            alVar28 = *local_1220;
            local_1228 = (undefined1 (*) [32])(lVar72 + (long)local_1c80 * 0x20);
            uVar9 = *(undefined8 *)*local_1228;
            uVar10 = *(undefined8 *)(*local_1228 + 8);
            uVar11 = *(undefined8 *)(*local_1228 + 0x10);
            uVar12 = *(undefined8 *)(*local_1228 + 0x18);
            auVar2 = *local_1228;
            local_1230 = (undefined1 (*) [32])(lVar114 + (long)local_1c80 * 0x20);
            uVar13 = *(undefined8 *)*local_1230;
            uVar14 = *(undefined8 *)(*local_1230 + 8);
            uVar15 = *(undefined8 *)(*local_1230 + 0x10);
            uVar16 = *(undefined8 *)(*local_1230 + 0x18);
            auVar3 = *local_1230;
            local_1238 = (undefined1 (*) [32])(lVar73 + (long)local_1c80 * 0x20);
            uVar17 = *(undefined8 *)*local_1238;
            uVar18 = *(undefined8 *)(*local_1238 + 8);
            uVar19 = *(undefined8 *)(*local_1238 + 0x10);
            uVar20 = *(undefined8 *)(*local_1238 + 0x18);
            auVar4 = *local_1238;
            local_1240 = local_1d30 + local_1c80;
            auVar71 = *(undefined1 (*) [24])*local_1240;
            lVar118 = (*local_1240)[3];
            alVar32 = *local_1240;
            local_1248 = local_1d38 + local_1c80;
            lVar115 = (*local_1248)[0];
            lVar116 = (*local_1248)[1];
            lVar117 = (*local_1248)[2];
            lVar21 = (*local_1248)[3];
            alVar22 = *local_1248;
            local_1760 = local_1d60;
            uStack_1758 = uStack_1d58;
            uStack_1750 = uStack_1d50;
            uStack_1748 = uStack_1d48;
            auVar47._8_8_ = uStack_1d58;
            auVar47._0_8_ = local_1d60;
            auVar47._16_8_ = uStack_1d50;
            auVar47._24_8_ = uStack_1d48;
            auVar7 = vpsubq_avx2((undefined1  [32])*local_11e8,auVar47);
            auVar46._16_8_ = auStack_1d70._0_8_;
            auVar46._0_16_ = local_1d80;
            auVar46._24_8_ = auStack_1d70._8_8_;
            auVar8 = vpsubq_avx2((undefined1  [32])*local_1208,auVar46);
            local_2000 = auVar7._0_8_;
            lStack_1ff8 = auVar7._8_8_;
            lStack_1ff0 = auVar7._16_8_;
            lStack_1fe8 = auVar7._24_8_;
            local_1fe0 = auVar8._0_8_;
            uStack_1fd8 = auVar8._8_8_;
            uStack_1fd0 = auVar8._16_8_;
            uStack_1fc8 = auVar8._24_8_;
            local_fa0 = local_2000;
            lStack_f98 = lStack_1ff8;
            lStack_f90 = lStack_1ff0;
            lStack_f88 = lStack_1fe8;
            local_fc0 = local_1fe0;
            uStack_fb8 = uStack_1fd8;
            uStack_fb0 = uStack_1fd0;
            uStack_fa8 = uStack_1fc8;
            auVar7 = vpcmpgtq_avx2(auVar7,auVar8);
            a[1] = in_stack_ffffffffffffdb80;
            a[0] = in_stack_ffffffffffffdb78;
            a[2] = in_stack_ffffffffffffdb88;
            a[3] = in_stack_ffffffffffffdb90;
            b[1] = in_stack_ffffffffffffdb60;
            b[0] = in_stack_ffffffffffffdb58;
            b[2] = in_stack_ffffffffffffdb68;
            b[3] = in_stack_ffffffffffffdb70;
            local_17a0 = local_1d80;
            auStack_1790 = auStack_1d70;
            _mm256_max_epi64_rpl(a,b);
            local_2020 = auVar68._0_8_;
            lStack_2018 = auVar68._8_8_;
            lStack_2010 = auVar68._16_8_;
            local_21e0._0_8_ = auVar65._0_8_;
            local_21e0._8_8_ = auVar65._8_8_;
            local_21e0._16_8_ = auVar65._16_8_;
            local_2380._0_8_ = auVar7._0_8_;
            local_2380._8_8_ = auVar7._8_8_;
            uStack_2370 = auVar7._16_8_;
            uStack_2368 = auVar7._24_8_;
            local_580 = local_2020;
            uStack_578 = lStack_2018;
            uStack_570 = lStack_2010;
            local_5a0 = local_21e0._0_8_;
            uStack_598 = local_21e0._8_8_;
            uStack_590 = local_21e0._16_8_;
            local_5c0 = local_2380._0_8_;
            uStack_5b8 = local_2380._8_8_;
            uStack_5b0 = uStack_2370;
            uStack_5a8 = uStack_2368;
            auVar5 = vpblendvb_avx2((undefined1  [32])alVar24,(undefined1  [32])alVar25,auVar7);
            local_2040 = auVar69._0_8_;
            lStack_2038 = auVar69._8_8_;
            lStack_2030 = auVar69._16_8_;
            local_2200._0_8_ = auVar66._0_8_;
            local_2200._8_8_ = auVar66._8_8_;
            local_2200._16_8_ = auVar66._16_8_;
            local_5e0 = local_2040;
            uStack_5d8 = lStack_2038;
            uStack_5d0 = lStack_2030;
            local_600 = local_2200._0_8_;
            uStack_5f8 = local_2200._8_8_;
            uStack_5f0 = local_2200._16_8_;
            local_620 = local_2380._0_8_;
            uStack_618 = local_2380._8_8_;
            uStack_610 = uStack_2370;
            uStack_608 = uStack_2368;
            auVar6 = vpblendvb_avx2((undefined1  [32])alVar26,(undefined1  [32])alVar27,auVar7);
            local_2060 = auVar70._0_8_;
            lStack_2058 = auVar70._8_8_;
            lStack_2050 = auVar70._16_8_;
            local_2220._0_8_ = auVar67._0_8_;
            local_2220._8_8_ = auVar67._8_8_;
            local_2220._16_8_ = auVar67._16_8_;
            local_640 = local_2060;
            uStack_638 = lStack_2058;
            uStack_630 = lStack_2050;
            local_660 = local_2220._0_8_;
            uStack_658 = local_2220._8_8_;
            uStack_650 = local_2220._16_8_;
            local_680 = local_2380._0_8_;
            uStack_678 = local_2380._8_8_;
            uStack_670 = uStack_2370;
            uStack_668 = uStack_2368;
            auVar7 = vpblendvb_avx2((undefined1  [32])alVar28,(undefined1  [32])alVar31,auVar7);
            local_2060 = auVar7._0_8_;
            lStack_2058 = auVar7._8_8_;
            lStack_2050 = auVar7._16_8_;
            lStack_2048 = auVar7._24_8_;
            local_18c0 = local_2060;
            uStack_18b8 = lStack_2058;
            uStack_18b0 = lStack_2050;
            uStack_18a8 = lStack_2048;
            local_18e0 = local_1de0;
            uStack_18d8 = uStack_1dd8;
            uStack_18d0 = uStack_1dd0;
            uStack_18c8 = uStack_1dc8;
            auVar42._8_8_ = uStack_1dd8;
            auVar42._0_8_ = local_1de0;
            auVar42._16_8_ = uStack_1dd0;
            auVar42._24_8_ = uStack_1dc8;
            auVar7 = vpaddq_avx2(auVar7,auVar42);
            local_23c0 = auVar71._0_8_;
            lStack_23b8 = auVar71._8_8_;
            lStack_23b0 = auVar71._16_8_;
            local_1900 = local_2080._0_8_;
            uStack_18f8 = local_2080._8_8_;
            uStack_18f0 = local_2080._16_8_;
            uStack_18e8 = local_2080._24_8_;
            local_1920 = local_23c0;
            uStack_1918 = lStack_23b8;
            uStack_1910 = lStack_23b0;
            auVar8 = vpaddq_avx2(local_2080,(undefined1  [32])alVar32);
            local_23c0 = auVar8._0_8_;
            lStack_23b8 = auVar8._8_8_;
            lStack_23b0 = auVar8._16_8_;
            lStack_23a8 = auVar8._24_8_;
            local_fe0 = local_2100._0_8_;
            lStack_fd8 = local_2100._8_8_;
            lStack_fd0 = local_2100._16_8_;
            lStack_fc8 = local_2100._24_8_;
            local_1000 = local_23c0;
            lStack_ff8 = lStack_23b8;
            lStack_ff0 = lStack_23b0;
            lStack_fe8 = lStack_23a8;
            local_480 = vpcmpgtq_avx2(local_2100,auVar8);
            local_340 = local_2100._0_8_;
            lStack_338 = local_2100._8_8_;
            lStack_330 = local_2100._16_8_;
            lStack_328 = local_2100._24_8_;
            local_360 = local_23c0;
            lStack_358 = lStack_23b8;
            lStack_350 = lStack_23b0;
            lStack_348 = lStack_23a8;
            local_4a0 = -(ulong)(local_2100._0_8_ == local_23c0);
            lStack_498 = -(ulong)(local_2100._8_8_ == lStack_23b8);
            lStack_490 = -(ulong)(local_2100._16_8_ == lStack_23b0);
            lStack_488 = -(ulong)(local_2100._24_8_ == lStack_23a8);
            auVar64._8_8_ = lStack_498;
            auVar64._0_8_ = local_4a0;
            auVar64._16_8_ = lStack_490;
            auVar64._24_8_ = lStack_488;
            auVar8 = vpor_avx2(local_480,auVar64);
            a_00[1] = in_stack_ffffffffffffdb80;
            a_00[0] = in_stack_ffffffffffffdb78;
            a_00[2] = in_stack_ffffffffffffdb88;
            a_00[3] = in_stack_ffffffffffffdb90;
            alVar31[1] = in_stack_ffffffffffffdb60;
            alVar31[0] = in_stack_ffffffffffffdb58;
            alVar31[2] = in_stack_ffffffffffffdb68;
            alVar31[3] = in_stack_ffffffffffffdb70;
            lStack_1908 = lVar118;
            lStack_648 = lVar124;
            lStack_628 = lVar121;
            lStack_5e8 = lVar123;
            lStack_5c8 = lVar120;
            lStack_588 = lVar122;
            lStack_568 = lVar119;
            _mm256_max_epi64_rpl(a_00,alVar31);
            local_2380._0_8_ = auVar8._0_8_;
            local_2380._8_8_ = auVar8._8_8_;
            uStack_2370 = auVar8._16_8_;
            uStack_2368 = auVar8._24_8_;
            local_6a0 = local_20a0._0_8_;
            uStack_698 = local_20a0._8_8_;
            uStack_690 = local_20a0._16_8_;
            uStack_688 = local_20a0._24_8_;
            local_6c0 = local_2160._0_8_;
            uStack_6b8 = local_2160._8_8_;
            uStack_6b0 = local_2160._16_8_;
            uStack_6a8 = local_2160._24_8_;
            local_6e0 = local_2380._0_8_;
            uStack_6d8 = local_2380._8_8_;
            uStack_6d0 = uStack_2370;
            uStack_6c8 = uStack_2368;
            local_2160 = vpblendvb_avx2(local_20a0,local_2160,auVar8);
            local_700 = local_20c0._0_8_;
            uStack_6f8 = local_20c0._8_8_;
            uStack_6f0 = local_20c0._16_8_;
            uStack_6e8 = local_20c0._24_8_;
            local_720 = local_2180._0_8_;
            uStack_718 = local_2180._8_8_;
            uStack_710 = local_2180._16_8_;
            uStack_708 = local_2180._24_8_;
            local_740 = local_2380._0_8_;
            uStack_738 = local_2380._8_8_;
            uStack_730 = uStack_2370;
            uStack_728 = uStack_2368;
            local_2180 = vpblendvb_avx2(local_20c0,local_2180,auVar8);
            local_1940 = local_20e0._0_8_;
            uStack_1938 = local_20e0._8_8_;
            uStack_1930 = local_20e0._16_8_;
            uStack_1928 = local_20e0._24_8_;
            local_760 = vpaddq_avx2(local_20e0,(undefined1  [32])alVar22);
            local_780 = local_21a0._0_8_;
            uStack_778 = local_21a0._8_8_;
            uStack_770 = local_21a0._16_8_;
            uStack_768 = local_21a0._24_8_;
            local_7a0 = local_2380._0_8_;
            uStack_798 = local_2380._8_8_;
            uStack_790 = uStack_2370;
            uStack_788 = uStack_2368;
            local_21a0 = vpblendvb_avx2(local_760,local_21a0,auVar8);
            local_1980 = local_2240[0];
            lStack_1978 = local_2240[1];
            lStack_1970 = local_2240[2];
            lStack_1968 = local_2240[3];
            auVar8 = vpaddq_avx2((undefined1  [32])local_2240,auVar2);
            local_19c0 = local_2260[0];
            lStack_19b8 = local_2260[1];
            lStack_19b0 = local_2260[2];
            lStack_19a8 = local_2260[3];
            auVar2 = vpaddq_avx2((undefined1  [32])local_2260,auVar3);
            local_1a00 = local_2280[0];
            lStack_19f8 = local_2280[1];
            lStack_19f0 = local_2280[2];
            lStack_19e8 = local_2280[3];
            auVar3 = vpaddq_avx2((undefined1  [32])local_2280,auVar4);
            local_1a40 = local_22a0[0];
            lStack_1a38 = local_22a0[1];
            lStack_1a30 = local_22a0[2];
            lStack_1a28 = local_22a0[3];
            local_1a60 = local_1de0;
            uStack_1a58 = uStack_1dd8;
            uStack_1a50 = uStack_1dd0;
            uStack_1a48 = uStack_1dc8;
            auVar41._8_8_ = uStack_1dd8;
            auVar41._0_8_ = local_1de0;
            auVar41._16_8_ = uStack_1dd0;
            auVar41._24_8_ = uStack_1dc8;
            auVar4 = vpaddq_avx2((undefined1  [32])local_22a0,auVar41);
            local_2240[0] = auVar8._0_8_;
            local_2240[1] = auVar8._8_8_;
            local_2240[2] = auVar8._16_8_;
            local_2240[3] = auVar8._24_8_;
            local_1040 = local_2240[0];
            lStack_1038 = local_2240[1];
            lStack_1030 = local_2240[2];
            lStack_1028 = local_2240[3];
            auVar55._8_8_ = lStack_1ff8;
            auVar55._0_8_ = local_2000;
            auVar55._16_8_ = lStack_1ff0;
            auVar55._24_8_ = lStack_1fe8;
            auVar8 = vpcmpgtq_avx2(auVar55,auVar8);
            a_01[1] = in_stack_ffffffffffffdb80;
            a_01[0] = in_stack_ffffffffffffdb78;
            a_01[2] = in_stack_ffffffffffffdb88;
            a_01[3] = in_stack_ffffffffffffdb90;
            alVar32[1] = in_stack_ffffffffffffdb60;
            alVar32[0] = in_stack_ffffffffffffdb58;
            alVar32[2] = in_stack_ffffffffffffdb68;
            alVar32[3] = in_stack_ffffffffffffdb70;
            local_2080._0_8_ = local_2000;
            local_2080._8_8_ = lStack_1ff8;
            local_2080._16_8_ = lStack_1ff0;
            local_2080._24_8_ = lStack_1fe8;
            local_1a20 = uVar17;
            uStack_1a18 = uVar18;
            uStack_1a10 = uVar19;
            uStack_1a08 = uVar20;
            local_19e0 = uVar13;
            uStack_19d8 = uVar14;
            uStack_19d0 = uVar15;
            uStack_19c8 = uVar16;
            local_19a0 = uVar9;
            uStack_1998 = uVar10;
            uStack_1990 = uVar11;
            uStack_1988 = uVar12;
            local_1960 = lVar115;
            lStack_1958 = lVar116;
            lStack_1950 = lVar117;
            lStack_1948 = lVar21;
            local_1020 = local_2000;
            lStack_1018 = lStack_1ff8;
            lStack_1010 = lStack_1ff0;
            lStack_1008 = lStack_1fe8;
            _mm256_max_epi64_rpl(a_01,alVar32);
            local_2260[0] = auVar2._0_8_;
            local_7c0 = local_2260[0];
            local_2260[1] = auVar2._8_8_;
            lStack_7b8 = local_2260[1];
            local_2260[2] = auVar2._16_8_;
            lStack_7b0 = local_2260[2];
            local_2260[3] = auVar2._24_8_;
            lStack_7a8 = local_2260[3];
            local_2020 = auVar5._0_8_;
            local_7e0 = local_2020;
            lStack_2018 = auVar5._8_8_;
            lStack_7d8 = lStack_2018;
            lStack_2010 = auVar5._16_8_;
            lStack_7d0 = lStack_2010;
            lStack_2008 = auVar5._24_8_;
            lStack_7c8 = lStack_2008;
            local_2380._0_8_ = auVar8._0_8_;
            local_800 = local_2380._0_8_;
            local_2380._8_8_ = auVar8._8_8_;
            uStack_7f8 = local_2380._8_8_;
            uStack_2370 = auVar8._16_8_;
            uStack_7f0 = uStack_2370;
            uStack_2368 = auVar8._24_8_;
            uStack_7e8 = uStack_2368;
            local_20a0 = vpblendvb_avx2(auVar2,auVar5,auVar8);
            local_2280[0] = auVar3._0_8_;
            local_820 = local_2280[0];
            local_2280[1] = auVar3._8_8_;
            lStack_818 = local_2280[1];
            local_2280[2] = auVar3._16_8_;
            lStack_810 = local_2280[2];
            local_2280[3] = auVar3._24_8_;
            lStack_808 = local_2280[3];
            local_2040 = auVar6._0_8_;
            local_840 = local_2040;
            lStack_2038 = auVar6._8_8_;
            lStack_838 = lStack_2038;
            lStack_2030 = auVar6._16_8_;
            lStack_830 = lStack_2030;
            lStack_2028 = auVar6._24_8_;
            lStack_828 = lStack_2028;
            local_860 = local_2380._0_8_;
            uStack_858 = local_2380._8_8_;
            uStack_850 = uStack_2370;
            uStack_848 = uStack_2368;
            local_20c0 = vpblendvb_avx2(auVar3,auVar6,auVar8);
            local_22a0[0] = auVar4._0_8_;
            local_880 = local_22a0[0];
            local_22a0[1] = auVar4._8_8_;
            lStack_878 = local_22a0[1];
            local_22a0[2] = auVar4._16_8_;
            lStack_870 = local_22a0[2];
            local_22a0[3] = auVar4._24_8_;
            lStack_868 = local_22a0[3];
            local_2060 = auVar7._0_8_;
            local_8a0 = local_2060;
            lStack_2058 = auVar7._8_8_;
            lStack_898 = lStack_2058;
            lStack_2050 = auVar7._16_8_;
            lStack_890 = lStack_2050;
            lStack_2048 = auVar7._24_8_;
            lStack_888 = lStack_2048;
            local_8c0 = local_2380._0_8_;
            uStack_8b8 = local_2380._8_8_;
            uStack_8b0 = uStack_2370;
            uStack_8a8 = uStack_2368;
            local_20e0 = vpblendvb_avx2(auVar4,auVar7,auVar8);
            local_1368 = local_1cd0 + local_1c80;
            (*local_1368)[0] = local_2000;
            (*local_1368)[1] = lStack_1ff8;
            (*local_1368)[2] = lStack_1ff0;
            (*local_1368)[3] = lStack_1fe8;
            local_13a8 = local_1cd8 + local_1c80;
            local_13e0 = local_2020;
            lStack_13d8 = lStack_2018;
            lStack_13d0 = lStack_2010;
            lStack_13c8 = lStack_2008;
            (*local_13a8)[0] = local_2020;
            (*local_13a8)[1] = lStack_2018;
            (*local_13a8)[2] = lStack_2010;
            (*local_13a8)[3] = lStack_2008;
            local_13e8 = local_1ce0 + local_1c80;
            local_1420 = local_2040;
            lStack_1418 = lStack_2038;
            lStack_1410 = lStack_2030;
            lStack_1408 = lStack_2028;
            (*local_13e8)[0] = local_2040;
            (*local_13e8)[1] = lStack_2038;
            (*local_13e8)[2] = lStack_2030;
            (*local_13e8)[3] = lStack_2028;
            local_1428 = local_1ce8 + local_1c80;
            local_1460 = local_2060;
            lStack_1458 = lStack_2058;
            lStack_1450 = lStack_2050;
            lStack_1448 = lStack_2048;
            (*local_1428)[0] = local_2060;
            (*local_1428)[1] = lStack_2058;
            (*local_1428)[2] = lStack_2050;
            (*local_1428)[3] = lStack_2048;
            local_1468 = local_1cf0 + local_1c80;
            local_14a0 = local_2240[0];
            lStack_1498 = local_2240[1];
            lStack_1490 = local_2240[2];
            lStack_1488 = local_2240[3];
            (*local_1468)[0] = local_2240[0];
            (*local_1468)[1] = local_2240[1];
            (*local_1468)[2] = local_2240[2];
            (*local_1468)[3] = local_2240[3];
            local_14a8 = local_1cf8 + local_1c80;
            local_14e0 = local_2260[0];
            lStack_14d8 = local_2260[1];
            lStack_14d0 = local_2260[2];
            lStack_14c8 = local_2260[3];
            (*local_14a8)[0] = local_2260[0];
            (*local_14a8)[1] = local_2260[1];
            (*local_14a8)[2] = local_2260[2];
            (*local_14a8)[3] = local_2260[3];
            local_14e8 = local_1d00 + local_1c80;
            local_1520 = local_2280[0];
            lStack_1518 = local_2280[1];
            lStack_1510 = local_2280[2];
            lStack_1508 = local_2280[3];
            (*local_14e8)[0] = local_2280[0];
            (*local_14e8)[1] = local_2280[1];
            (*local_14e8)[2] = local_2280[2];
            (*local_14e8)[3] = local_2280[3];
            local_1528 = local_1d08 + local_1c80;
            local_1560 = local_22a0[0];
            lStack_1558 = local_22a0[1];
            lStack_1550 = local_22a0[2];
            lStack_1548 = local_22a0[3];
            (*local_1528)[0] = local_22a0[0];
            (*local_1528)[1] = local_22a0[1];
            (*local_1528)[2] = local_22a0[2];
            (*local_1528)[3] = local_22a0[3];
            local_1c80 = local_1c80 + 1;
            local_22a0 = alVar34;
            local_2280 = alVar36;
            local_2260 = alVar33;
            local_2240 = alVar23;
            local_13a0 = local_2000;
            lStack_1398 = lStack_1ff8;
            lStack_1390 = lStack_1ff0;
            lStack_1388 = lStack_1fe8;
          }
          auVar7 = vpermq_avx2(local_2080,0x90);
          auVar7 = vpblendd_avx2(auVar7,ZEXT832(0) << 0x40,3);
          auVar8 = vpermq_avx2(local_20a0,0x90);
          local_20a0 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x40,3);
          auVar8 = vpermq_avx2(local_20c0,0x90);
          local_20c0 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x40,3);
          auVar8 = vpermq_avx2(local_20e0,0x90);
          local_20e0 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x40,3);
          iVar1 = local_1d40[(long)local_1c84 + 1];
          local_1250 = local_1d30;
          auVar65 = *(undefined1 (*) [24])*local_1d30;
          lStack_1a88 = (*local_1d30)[3];
          local_1258 = local_1d38;
          lVar122 = (*local_1d38)[0];
          lVar123 = (*local_1d38)[1];
          lVar124 = (*local_1d38)[2];
          lVar119 = (*local_1d38)[3];
          alVar22 = *local_1d38;
          local_2080._8_8_ = auVar7._8_8_;
          local_2080._16_8_ = auVar7._16_8_;
          local_2080._24_8_ = auVar7._24_8_;
          local_23c0 = auVar65._0_8_;
          lStack_23b8 = auVar65._8_8_;
          lStack_23b0 = auVar65._16_8_;
          uStack_1a78 = local_2080._8_8_;
          uStack_1a70 = local_2080._16_8_;
          uStack_1a68 = local_2080._24_8_;
          local_1aa0 = local_23c0;
          uStack_1a98 = lStack_23b8;
          uStack_1a90 = lStack_23b0;
          auVar40._8_8_ = local_2080._8_8_;
          auVar40._0_8_ = iVar1;
          auVar40._16_8_ = local_2080._16_8_;
          auVar40._24_8_ = local_2080._24_8_;
          auVar7 = vpaddq_avx2(auVar40,(undefined1  [32])*local_1d30);
          local_23c0 = auVar7._0_8_;
          lStack_23b8 = auVar7._8_8_;
          lStack_23b0 = auVar7._16_8_;
          lStack_23a8 = auVar7._24_8_;
          local_1060 = local_23c0;
          lStack_1058 = lStack_23b8;
          lStack_1050 = lStack_23b0;
          lStack_1048 = lStack_23a8;
          local_1080 = local_2100._0_8_;
          lStack_1078 = local_2100._8_8_;
          lStack_1070 = local_2100._16_8_;
          lStack_1068 = local_2100._24_8_;
          local_4c0 = vpcmpgtq_avx2(auVar7,local_2100);
          local_380 = local_23c0;
          lStack_378 = lStack_23b8;
          lStack_370 = lStack_23b0;
          lStack_368 = lStack_23a8;
          local_3a0 = local_2100._0_8_;
          lStack_398 = local_2100._8_8_;
          lStack_390 = local_2100._16_8_;
          lStack_388 = local_2100._24_8_;
          local_4e0 = -(ulong)(local_23c0 == local_2100._0_8_);
          lStack_4d8 = -(ulong)(lStack_23b8 == local_2100._8_8_);
          lStack_4d0 = -(ulong)(lStack_23b0 == local_2100._16_8_);
          lStack_4c8 = -(ulong)(lStack_23a8 == local_2100._24_8_);
          auVar63._8_8_ = lStack_4d8;
          auVar63._0_8_ = local_4e0;
          auVar63._16_8_ = lStack_4d0;
          auVar63._24_8_ = lStack_4c8;
          auVar7 = vpor_avx2(local_4c0,auVar63);
          alVar36[1] = in_stack_ffffffffffffdb80;
          alVar36[0] = in_stack_ffffffffffffdb78;
          alVar36[2] = in_stack_ffffffffffffdb88;
          alVar36[3] = in_stack_ffffffffffffdb90;
          alVar33[1] = in_stack_ffffffffffffdb60;
          alVar33[0] = in_stack_ffffffffffffdb58;
          alVar33[2] = in_stack_ffffffffffffdb68;
          alVar33[3] = in_stack_ffffffffffffdb70;
          local_1a80 = iVar1;
          _mm256_max_epi64_rpl(alVar36,alVar33);
          local_2380._0_8_ = auVar7._0_8_;
          local_2380._8_8_ = auVar7._8_8_;
          uStack_2370 = auVar7._16_8_;
          uStack_2368 = auVar7._24_8_;
          local_8e0 = local_2160._0_8_;
          uStack_8d8 = local_2160._8_8_;
          uStack_8d0 = local_2160._16_8_;
          uStack_8c8 = local_2160._24_8_;
          local_900 = local_20a0._0_8_;
          uStack_8f8 = local_20a0._8_8_;
          uStack_8f0 = local_20a0._16_8_;
          uStack_8e8 = local_20a0._24_8_;
          local_920 = local_2380._0_8_;
          uStack_918 = local_2380._8_8_;
          uStack_910 = uStack_2370;
          uStack_908 = uStack_2368;
          local_2160 = vpblendvb_avx2(local_2160,local_20a0,auVar7);
          local_940 = local_2180._0_8_;
          uStack_938 = local_2180._8_8_;
          uStack_930 = local_2180._16_8_;
          uStack_928 = local_2180._24_8_;
          local_960 = local_20c0._0_8_;
          uStack_958 = local_20c0._8_8_;
          uStack_950 = local_20c0._16_8_;
          uStack_948 = local_20c0._24_8_;
          local_980 = local_2380._0_8_;
          uStack_978 = local_2380._8_8_;
          uStack_970 = uStack_2370;
          uStack_968 = uStack_2368;
          local_2180 = vpblendvb_avx2(local_2180,local_20c0,auVar7);
          local_1ac0 = local_20e0._0_8_;
          uStack_1ab8 = local_20e0._8_8_;
          uStack_1ab0 = local_20e0._16_8_;
          uStack_1aa8 = local_20e0._24_8_;
          local_9c0 = vpaddq_avx2(local_20e0,(undefined1  [32])alVar22);
          local_9a0 = local_21a0._0_8_;
          uStack_998 = local_21a0._8_8_;
          uStack_990 = local_21a0._16_8_;
          uStack_988 = local_21a0._24_8_;
          local_9e0 = local_2380._0_8_;
          uStack_9d8 = local_2380._8_8_;
          uStack_9d0 = uStack_2370;
          uStack_9c8 = uStack_2368;
          local_21a0 = vpblendvb_avx2(local_21a0,local_9c0,auVar7);
          local_1ae0 = lVar122;
          lStack_1ad8 = lVar123;
          lStack_1ad0 = lVar124;
          lStack_1ac8 = lVar119;
          for (local_1c80 = 0; local_1c80 < local_1ca4 + -2; local_1c80 = local_1c80 + 1) {
            auVar7 = vpermq_avx2(local_2100,0x90);
            auVar7 = vpblendd_avx2(auVar7,ZEXT832(0) << 0x20,3);
            auVar8 = vpermq_avx2(local_2160,0x90);
            auVar8 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x20,3);
            auVar2 = vpermq_avx2(local_2180,0x90);
            auVar2 = vpblendd_avx2(auVar2,ZEXT832(0) << 0x20,3);
            auVar3 = vpermq_avx2(local_21a0,0x90);
            auVar3 = vpblendd_avx2(auVar3,ZEXT832(0) << 0x20,3);
            local_2400 = auVar7._0_8_;
            lStack_23f8 = auVar7._8_8_;
            lStack_23f0 = auVar7._16_8_;
            lStack_23e8 = auVar7._24_8_;
            local_1b00 = local_2400;
            uStack_1af8 = lStack_23f8;
            uStack_1af0 = lStack_23f0;
            uStack_1ae8 = lStack_23e8;
            local_1b20 = local_1ec0._0_8_;
            uStack_1b18 = local_1ec0._8_8_;
            uStack_1b10 = local_1ec0._16_8_;
            uStack_1b08 = local_1ec0._24_8_;
            auVar7 = vpaddq_avx2(auVar7,local_1ec0);
            local_2400 = auVar7._0_8_;
            lStack_23f8 = auVar7._8_8_;
            lStack_23f0 = auVar7._16_8_;
            lStack_23e8 = auVar7._24_8_;
            local_10a0 = local_2400;
            lStack_1098 = lStack_23f8;
            lStack_1090 = lStack_23f0;
            lStack_1088 = lStack_23e8;
            local_10c0 = local_2100._0_8_;
            lStack_10b8 = local_2100._8_8_;
            lStack_10b0 = local_2100._16_8_;
            lStack_10a8 = local_2100._24_8_;
            local_500 = vpcmpgtq_avx2(auVar7,local_2100);
            local_3c0 = local_2400;
            lStack_3b8 = lStack_23f8;
            lStack_3b0 = lStack_23f0;
            lStack_3a8 = lStack_23e8;
            local_3e0 = local_2100._0_8_;
            lStack_3d8 = local_2100._8_8_;
            lStack_3d0 = local_2100._16_8_;
            lStack_3c8 = local_2100._24_8_;
            local_520 = -(ulong)(local_2400 == local_2100._0_8_);
            lStack_518 = -(ulong)(lStack_23f8 == local_2100._8_8_);
            lStack_510 = -(ulong)(lStack_23f0 == local_2100._16_8_);
            lStack_508 = -(ulong)(lStack_23e8 == local_2100._24_8_);
            auVar62._8_8_ = lStack_518;
            auVar62._0_8_ = local_520;
            auVar62._16_8_ = lStack_510;
            auVar62._24_8_ = lStack_508;
            auVar7 = vpor_avx2(local_500,auVar62);
            a_02[1] = in_stack_ffffffffffffdb80;
            a_02[0] = in_stack_ffffffffffffdb78;
            a_02[2] = in_stack_ffffffffffffdb88;
            a_02[3] = in_stack_ffffffffffffdb90;
            alVar34[1] = in_stack_ffffffffffffdb60;
            alVar34[0] = in_stack_ffffffffffffdb58;
            alVar34[2] = in_stack_ffffffffffffdb68;
            alVar34[3] = in_stack_ffffffffffffdb70;
            _mm256_max_epi64_rpl(a_02,alVar34);
            local_a00 = local_2160._0_8_;
            uStack_9f8 = local_2160._8_8_;
            uStack_9f0 = local_2160._16_8_;
            uStack_9e8 = local_2160._24_8_;
            local_2420 = auVar8._0_8_;
            local_a20 = local_2420;
            uStack_2418 = auVar8._8_8_;
            uStack_a18 = uStack_2418;
            uStack_2410 = auVar8._16_8_;
            uStack_a10 = uStack_2410;
            uStack_2408 = auVar8._24_8_;
            uStack_a08 = uStack_2408;
            local_2380._0_8_ = auVar7._0_8_;
            local_a40 = local_2380._0_8_;
            local_2380._8_8_ = auVar7._8_8_;
            uStack_a38 = local_2380._8_8_;
            uStack_2370 = auVar7._16_8_;
            uStack_a30 = uStack_2370;
            uStack_2368 = auVar7._24_8_;
            uStack_a28 = uStack_2368;
            local_2160 = vpblendvb_avx2(local_2160,auVar8,auVar7);
            local_a60 = local_2180._0_8_;
            uStack_a58 = local_2180._8_8_;
            uStack_a50 = local_2180._16_8_;
            uStack_a48 = local_2180._24_8_;
            local_2440 = auVar2._0_8_;
            local_a80 = local_2440;
            uStack_2438 = auVar2._8_8_;
            uStack_a78 = uStack_2438;
            uStack_2430 = auVar2._16_8_;
            uStack_a70 = uStack_2430;
            uStack_2428 = auVar2._24_8_;
            uStack_a68 = uStack_2428;
            local_aa0 = local_2380._0_8_;
            uStack_a98 = local_2380._8_8_;
            uStack_a90 = uStack_2370;
            uStack_a88 = uStack_2368;
            local_2180 = vpblendvb_avx2(local_2180,auVar2,auVar7);
            local_ac0 = local_21a0._0_8_;
            uStack_ab8 = local_21a0._8_8_;
            uStack_ab0 = local_21a0._16_8_;
            uStack_aa8 = local_21a0._24_8_;
            local_2460 = auVar3._0_8_;
            local_1b40 = local_2460;
            uStack_2458 = auVar3._8_8_;
            uStack_1b38 = uStack_2458;
            uStack_2450 = auVar3._16_8_;
            uStack_1b30 = uStack_2450;
            uStack_2448 = auVar3._24_8_;
            uStack_1b28 = uStack_2448;
            local_1b60 = local_1ee0._0_8_;
            uStack_1b58 = local_1ee0._8_8_;
            uStack_1b50 = local_1ee0._16_8_;
            uStack_1b48 = local_1ee0._24_8_;
            local_ae0 = vpaddq_avx2(auVar3,local_1ee0);
            local_b00 = local_2380._0_8_;
            uStack_af8 = local_2380._8_8_;
            uStack_af0 = uStack_2370;
            uStack_ae8 = uStack_2368;
            local_21a0 = vpblendvb_avx2(local_21a0,local_ae0,auVar7);
          }
          auVar7 = vpermq_avx2(local_2100,0x90);
          auVar7 = vpblendd_avx2(auVar7,ZEXT832(0) << 0x20,3);
          auVar8 = vpermq_avx2(local_2160,0x90);
          local_2160 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x20,3);
          auVar8 = vpermq_avx2(local_2180,0x90);
          local_2180 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x20,3);
          auVar8 = vpermq_avx2(local_21a0,0x90);
          local_21a0 = vpblendd_avx2(auVar8,ZEXT832(0) << 0x20,3);
          local_2100._0_8_ = auVar7._0_8_;
          local_2100._8_8_ = auVar7._8_8_;
          local_2100._16_8_ = auVar7._16_8_;
          local_2100._24_8_ = auVar7._24_8_;
          local_1b80 = local_2100._0_8_;
          uStack_1b78 = local_2100._8_8_;
          uStack_1b70 = local_2100._16_8_;
          uStack_1b68 = local_2100._24_8_;
          local_1ba0 = local_1ea0;
          uStack_1b98 = uStack_1e98;
          uStack_1b90 = uStack_1e90;
          uStack_1b88 = uStack_1e88;
          auVar39._8_8_ = uStack_1e98;
          auVar39._0_8_ = local_1ea0;
          auVar39._16_8_ = uStack_1e90;
          auVar39._24_8_ = uStack_1e88;
          auVar7 = vpaddq_avx2(auVar7,auVar39);
          local_2100._0_8_ = auVar7._0_8_;
          local_2100._8_8_ = auVar7._8_8_;
          local_2100._16_8_ = auVar7._16_8_;
          local_2100._24_8_ = auVar7._24_8_;
          local_10e0 = local_2100._0_8_;
          lStack_10d8 = local_2100._8_8_;
          lStack_10d0 = local_2100._16_8_;
          lStack_10c8 = local_2100._24_8_;
          uStack_10f8 = local_2080._8_8_;
          uStack_10f0 = local_2080._16_8_;
          uStack_10e8 = local_2080._24_8_;
          auVar54._8_8_ = local_2080._8_8_;
          auVar54._0_8_ = iVar1;
          auVar54._16_8_ = local_2080._16_8_;
          auVar54._24_8_ = local_2080._24_8_;
          auVar8 = vpcmpgtq_avx2(auVar7,auVar54);
          a_03[1] = in_stack_ffffffffffffdb80;
          a_03[0] = in_stack_ffffffffffffdb78;
          a_03[2] = in_stack_ffffffffffffdb88;
          a_03[3] = in_stack_ffffffffffffdb90;
          b_00[1] = in_stack_ffffffffffffdb60;
          b_00[0] = in_stack_ffffffffffffdb58;
          b_00[2] = in_stack_ffffffffffffdb68;
          b_00[3] = in_stack_ffffffffffffdb70;
          local_1100 = iVar1;
          _mm256_max_epi64_rpl(a_03,b_00);
          local_2380._0_8_ = auVar8._0_8_;
          local_2380._8_8_ = auVar8._8_8_;
          uStack_2370 = auVar8._16_8_;
          uStack_2368 = auVar8._24_8_;
          local_b20 = local_20a0._0_8_;
          uStack_b18 = local_20a0._8_8_;
          uStack_b10 = local_20a0._16_8_;
          uStack_b08 = local_20a0._24_8_;
          local_b40 = local_2160._0_8_;
          uStack_b38 = local_2160._8_8_;
          uStack_b30 = local_2160._16_8_;
          uStack_b28 = local_2160._24_8_;
          local_b60 = local_2380._0_8_;
          uStack_b58 = local_2380._8_8_;
          uStack_b50 = uStack_2370;
          uStack_b48 = uStack_2368;
          local_21e0 = vpblendvb_avx2(local_20a0,local_2160,auVar8);
          local_b80 = local_20c0._0_8_;
          uStack_b78 = local_20c0._8_8_;
          uStack_b70 = local_20c0._16_8_;
          uStack_b68 = local_20c0._24_8_;
          local_ba0 = local_2180._0_8_;
          uStack_b98 = local_2180._8_8_;
          uStack_b90 = local_2180._16_8_;
          uStack_b88 = local_2180._24_8_;
          local_bc0 = local_2380._0_8_;
          uStack_bb8 = local_2380._8_8_;
          uStack_bb0 = uStack_2370;
          uStack_ba8 = uStack_2368;
          local_2200 = vpblendvb_avx2(local_20c0,local_2180,auVar8);
          local_be0 = local_20e0._0_8_;
          uStack_bd8 = local_20e0._8_8_;
          uStack_bd0 = local_20e0._16_8_;
          uStack_bc8 = local_20e0._24_8_;
          local_c00 = local_21a0._0_8_;
          uStack_bf8 = local_21a0._8_8_;
          uStack_bf0 = local_21a0._16_8_;
          uStack_be8 = local_21a0._24_8_;
          local_c20 = local_2380._0_8_;
          uStack_c18 = local_2380._8_8_;
          uStack_c10 = uStack_2370;
          uStack_c08 = uStack_2368;
          local_2220 = vpblendvb_avx2(local_20e0,local_21a0,auVar8);
          local_1c80 = 0;
          local_21c0 = local_2100._0_8_;
          lStack_21b8 = local_2100._8_8_;
          lStack_21b0 = local_2100._16_8_;
          lStack_21a8 = local_2100._24_8_;
          local_2100 = auVar7;
          while( true ) {
            if (local_1ca8 <= local_1c80) break;
            local_1260 = local_1cf0 + local_1c80;
            auVar65 = *(undefined1 (*) [24])*local_1260;
            lVar72 = (*local_1260)[3];
            local_1268 = local_1cf8 + local_1c80;
            auVar66 = *(undefined1 (*) [24])*local_1268;
            lVar122 = (*local_1268)[3];
            alVar23 = *local_1268;
            local_1270 = local_1d00 + local_1c80;
            auVar67 = *(undefined1 (*) [24])*local_1270;
            lVar123 = (*local_1270)[3];
            alVar25 = *local_1270;
            local_1278 = local_1d08 + local_1c80;
            auVar68 = *(undefined1 (*) [24])*local_1278;
            lVar124 = (*local_1278)[3];
            alVar27 = *local_1278;
            local_1280 = local_1cd0 + local_1c80;
            local_1288 = local_1cd8 + local_1c80;
            auVar69 = *(undefined1 (*) [24])*local_1288;
            lVar119 = (*local_1288)[3];
            alVar22 = *local_1288;
            local_1290 = local_1ce0 + local_1c80;
            auVar70 = *(undefined1 (*) [24])*local_1290;
            lVar120 = (*local_1290)[3];
            alVar24 = *local_1290;
            local_1298 = local_1ce8 + local_1c80;
            auVar71 = *(undefined1 (*) [24])*local_1298;
            lVar121 = (*local_1298)[3];
            alVar26 = *local_1298;
            local_17c0 = local_21c0;
            lStack_17b8 = lStack_21b8;
            lStack_17b0 = lStack_21b0;
            lStack_17a8 = lStack_21a8;
            local_17e0 = local_1d60;
            uStack_17d8 = uStack_1d58;
            uStack_17d0 = uStack_1d50;
            uStack_17c8 = uStack_1d48;
            auVar45._8_8_ = lStack_21b8;
            auVar45._0_8_ = local_21c0;
            auVar45._16_8_ = lStack_21b0;
            auVar45._24_8_ = lStack_21a8;
            auVar44._8_8_ = uStack_1d58;
            auVar44._0_8_ = local_1d60;
            auVar44._16_8_ = uStack_1d50;
            auVar44._24_8_ = uStack_1d48;
            auVar7 = vpsubq_avx2(auVar45,auVar44);
            local_1800 = local_2100._0_8_;
            uStack_17f8 = local_2100._8_8_;
            uStack_17f0 = local_2100._16_8_;
            uStack_17e8 = local_2100._24_8_;
            auVar43._16_8_ = auStack_1d70._0_8_;
            auVar43._0_16_ = local_1d80;
            auVar43._24_8_ = auStack_1d70._8_8_;
            auVar8 = vpsubq_avx2(local_2100,auVar43);
            local_2140 = auVar7._0_8_;
            lStack_2138 = auVar7._8_8_;
            lStack_2130 = auVar7._16_8_;
            lStack_2128 = auVar7._24_8_;
            a_04[1] = in_stack_ffffffffffffdb80;
            a_04[0] = in_stack_ffffffffffffdb78;
            a_04[2] = in_stack_ffffffffffffdb88;
            a_04[3] = in_stack_ffffffffffffdb90;
            b_01[1] = in_stack_ffffffffffffdb60;
            b_01[0] = in_stack_ffffffffffffdb58;
            b_01[2] = in_stack_ffffffffffffdb68;
            b_01[3] = in_stack_ffffffffffffdb70;
            local_2100._0_8_ = local_2140;
            local_2100._8_8_ = lStack_2138;
            local_2100._16_8_ = lStack_2130;
            local_2100._24_8_ = lStack_2128;
            local_1820 = local_1d80;
            auStack_1810 = auStack_1d70;
            _mm256_max_epi64_rpl(a_04,b_01);
            local_2120 = auVar8._0_8_;
            uStack_2118 = auVar8._8_8_;
            uStack_2110 = auVar8._16_8_;
            uStack_2108 = auVar8._24_8_;
            local_1120 = local_2140;
            lStack_1118 = lStack_2138;
            lStack_1110 = lStack_2130;
            lStack_1108 = lStack_2128;
            local_1140 = local_2120;
            uStack_1138 = uStack_2118;
            uStack_1130 = uStack_2110;
            uStack_1128 = uStack_2108;
            auVar7 = vpcmpgtq_avx2(auVar7,auVar8);
            local_2380._0_8_ = auVar7._0_8_;
            local_2380._8_8_ = auVar7._8_8_;
            uStack_2370 = auVar7._16_8_;
            uStack_2368 = auVar7._24_8_;
            local_c40 = local_2160._0_8_;
            uStack_c38 = local_2160._8_8_;
            uStack_c30 = local_2160._16_8_;
            uStack_c28 = local_2160._24_8_;
            local_c60 = local_21e0._0_8_;
            uStack_c58 = local_21e0._8_8_;
            uStack_c50 = local_21e0._16_8_;
            uStack_c48 = local_21e0._24_8_;
            local_c80 = local_2380._0_8_;
            uStack_c78 = local_2380._8_8_;
            uStack_c70 = uStack_2370;
            uStack_c68 = uStack_2368;
            local_2160 = vpblendvb_avx2(local_2160,local_21e0,auVar7);
            local_ca0 = local_2180._0_8_;
            uStack_c98 = local_2180._8_8_;
            uStack_c90 = local_2180._16_8_;
            uStack_c88 = local_2180._24_8_;
            local_cc0 = local_2200._0_8_;
            uStack_cb8 = local_2200._8_8_;
            uStack_cb0 = local_2200._16_8_;
            uStack_ca8 = local_2200._24_8_;
            local_ce0 = local_2380._0_8_;
            uStack_cd8 = local_2380._8_8_;
            uStack_cd0 = uStack_2370;
            uStack_cc8 = uStack_2368;
            local_2180 = vpblendvb_avx2(local_2180,local_2200,auVar7);
            local_d00 = local_21a0._0_8_;
            uStack_cf8 = local_21a0._8_8_;
            uStack_cf0 = local_21a0._16_8_;
            uStack_ce8 = local_21a0._24_8_;
            local_d20 = local_2220._0_8_;
            uStack_d18 = local_2220._8_8_;
            uStack_d10 = local_2220._16_8_;
            uStack_d08 = local_2220._24_8_;
            local_d40 = local_2380._0_8_;
            uStack_d38 = local_2380._8_8_;
            uStack_d30 = uStack_2370;
            uStack_d28 = uStack_2368;
            auVar7 = vpblendvb_avx2(local_21a0,local_2220,auVar7);
            local_21a0._0_8_ = auVar7._0_8_;
            local_21a0._8_8_ = auVar7._8_8_;
            local_21a0._16_8_ = auVar7._16_8_;
            local_21a0._24_8_ = auVar7._24_8_;
            local_1bc0 = local_21a0._0_8_;
            uStack_1bb8 = local_21a0._8_8_;
            uStack_1bb0 = local_21a0._16_8_;
            uStack_1ba8 = local_21a0._24_8_;
            local_1be0 = local_1de0;
            uStack_1bd8 = uStack_1dd8;
            uStack_1bd0 = uStack_1dd0;
            uStack_1bc8 = uStack_1dc8;
            auVar38._8_8_ = uStack_1dd8;
            auVar38._0_8_ = local_1de0;
            auVar38._16_8_ = uStack_1dd0;
            auVar38._24_8_ = uStack_1dc8;
            local_21a0 = vpaddq_avx2(auVar7,auVar38);
            local_2240[0] = auVar65._0_8_;
            local_2240[1] = auVar65._8_8_;
            local_2240[2] = auVar65._16_8_;
            a_05[1] = in_stack_ffffffffffffdb80;
            a_05[0] = in_stack_ffffffffffffdb78;
            a_05[2] = in_stack_ffffffffffffdb88;
            a_05[3] = in_stack_ffffffffffffdb90;
            b_02[1] = in_stack_ffffffffffffdb60;
            b_02[0] = in_stack_ffffffffffffdb58;
            b_02[2] = in_stack_ffffffffffffdb68;
            b_02[3] = in_stack_ffffffffffffdb70;
            local_21c0 = local_2240[0];
            lStack_21b8 = local_2240[1];
            lStack_21b0 = local_2240[2];
            lStack_21a8 = lVar72;
            _mm256_max_epi64_rpl(a_05,b_02);
            a_06[1] = in_stack_ffffffffffffdb80;
            a_06[0] = in_stack_ffffffffffffdb78;
            a_06[2] = in_stack_ffffffffffffdb88;
            a_06[3] = in_stack_ffffffffffffdb90;
            b_03[1] = in_stack_ffffffffffffdb60;
            b_03[0] = in_stack_ffffffffffffdb58;
            b_03[2] = in_stack_ffffffffffffdb68;
            b_03[3] = in_stack_ffffffffffffdb70;
            _mm256_max_epi64_rpl(a_06,b_03);
            local_420 = local_2240[0];
            lStack_418 = local_2240[1];
            lStack_410 = local_2240[2];
            local_f80 = -(ulong)(local_21c0 == local_2240[0]);
            lStack_f78 = -(ulong)(lStack_21b8 == local_2240[1]);
            lStack_f70 = -(ulong)(lStack_21b0 == local_2240[2]);
            lStack_f68 = -(ulong)(lStack_21a8 == lVar72);
            local_2380._8_8_ = lStack_f78;
            local_2380._0_8_ = local_f80;
            local_f20 = -(ulong)(local_21c0 == local_2100._0_8_);
            lStack_f18 = -(ulong)(lStack_21b8 == local_2100._8_8_);
            lStack_f10 = -(ulong)(lStack_21b0 == local_2100._16_8_);
            lStack_f08 = -(ulong)(lStack_21a8 == local_2100._24_8_);
            local_2020 = auVar69._0_8_;
            lStack_2018 = auVar69._8_8_;
            lStack_2010 = auVar69._16_8_;
            local_d60 = local_2020;
            uStack_d58 = lStack_2018;
            uStack_d50 = lStack_2010;
            local_d80 = local_2160._0_8_;
            uStack_d78 = local_2160._8_8_;
            uStack_d70 = local_2160._16_8_;
            uStack_d68 = local_2160._24_8_;
            auVar61._8_8_ = lStack_f18;
            auVar61._0_8_ = local_f20;
            auVar61._16_8_ = lStack_f10;
            auVar61._24_8_ = lStack_f08;
            local_dc0 = vpblendvb_avx2((undefined1  [32])alVar22,local_2160,auVar61);
            local_2260[0] = auVar66._0_8_;
            local_2260[1] = auVar66._8_8_;
            local_2260[2] = auVar66._16_8_;
            local_de0 = local_2260[0];
            uStack_dd8 = local_2260[1];
            uStack_dd0 = local_2260[2];
            auVar60._16_8_ = lStack_f70;
            auVar60._0_16_ = local_2380;
            auVar60._24_8_ = lStack_f68;
            local_21e0 = vpblendvb_avx2(local_dc0,(undefined1  [32])alVar23,auVar60);
            local_2040 = auVar70._0_8_;
            lStack_2038 = auVar70._8_8_;
            lStack_2030 = auVar70._16_8_;
            local_e20 = local_2040;
            uStack_e18 = lStack_2038;
            uStack_e10 = lStack_2030;
            local_e40 = local_2180._0_8_;
            uStack_e38 = local_2180._8_8_;
            uStack_e30 = local_2180._16_8_;
            uStack_e28 = local_2180._24_8_;
            auVar59._8_8_ = lStack_f18;
            auVar59._0_8_ = local_f20;
            auVar59._16_8_ = lStack_f10;
            auVar59._24_8_ = lStack_f08;
            local_e80 = vpblendvb_avx2((undefined1  [32])alVar24,local_2180,auVar59);
            local_2280[0] = auVar67._0_8_;
            local_2280[1] = auVar67._8_8_;
            local_2280[2] = auVar67._16_8_;
            local_ea0 = local_2280[0];
            uStack_e98 = local_2280[1];
            uStack_e90 = local_2280[2];
            auVar58._16_8_ = lStack_f70;
            auVar58._0_16_ = local_2380;
            auVar58._24_8_ = lStack_f68;
            local_2200 = vpblendvb_avx2(local_e80,(undefined1  [32])alVar25,auVar58);
            local_2060 = auVar71._0_8_;
            lStack_2058 = auVar71._8_8_;
            lStack_2050 = auVar71._16_8_;
            local_ee0 = local_2060;
            uStack_ed8 = lStack_2058;
            uStack_ed0 = lStack_2050;
            local_f00 = local_21a0._0_8_;
            uStack_ef8 = local_21a0._8_8_;
            uStack_ef0 = local_21a0._16_8_;
            uStack_ee8 = local_21a0._24_8_;
            auVar57._8_8_ = lStack_f18;
            auVar57._0_8_ = local_f20;
            auVar57._16_8_ = lStack_f10;
            auVar57._24_8_ = lStack_f08;
            local_f40 = vpblendvb_avx2((undefined1  [32])alVar26,local_21a0,auVar57);
            local_22a0[0] = auVar68._0_8_;
            local_22a0[1] = auVar68._8_8_;
            local_22a0[2] = auVar68._16_8_;
            local_f60 = local_22a0[0];
            uStack_f58 = local_22a0[1];
            uStack_f50 = local_22a0[2];
            auVar56._16_8_ = lStack_f70;
            auVar56._0_16_ = local_2380;
            auVar56._24_8_ = lStack_f68;
            local_2220 = vpblendvb_avx2(local_f40,(undefined1  [32])alVar27,auVar56);
            local_1568 = local_1cf0 + local_1c80;
            (*local_1568)[0] = local_21c0;
            (*local_1568)[1] = lStack_21b8;
            (*local_1568)[2] = lStack_21b0;
            (*local_1568)[3] = lStack_21a8;
            local_15a8 = local_1cf8 + local_1c80;
            local_15e0 = local_21e0._0_8_;
            lStack_15d8 = local_21e0._8_8_;
            lStack_15d0 = local_21e0._16_8_;
            lStack_15c8 = local_21e0._24_8_;
            (*local_15a8)[0] = local_21e0._0_8_;
            (*local_15a8)[1] = local_21e0._8_8_;
            (*local_15a8)[2] = local_21e0._16_8_;
            (*local_15a8)[3] = local_21e0._24_8_;
            local_15e8 = local_1d00 + local_1c80;
            local_1620 = local_2200._0_8_;
            lStack_1618 = local_2200._8_8_;
            lStack_1610 = local_2200._16_8_;
            lStack_1608 = local_2200._24_8_;
            (*local_15e8)[0] = local_2200._0_8_;
            (*local_15e8)[1] = local_2200._8_8_;
            (*local_15e8)[2] = local_2200._16_8_;
            (*local_15e8)[3] = local_2200._24_8_;
            local_1628 = local_1d08 + local_1c80;
            local_1660 = local_2220._0_8_;
            lStack_1658 = local_2220._8_8_;
            lStack_1650 = local_2220._16_8_;
            lStack_1648 = local_2220._24_8_;
            (*local_1628)[0] = local_2220._0_8_;
            (*local_1628)[1] = local_2220._8_8_;
            (*local_1628)[2] = local_2220._16_8_;
            (*local_1628)[3] = local_2220._24_8_;
            a_07[1] = in_stack_ffffffffffffdb80;
            a_07[0] = in_stack_ffffffffffffdb78;
            a_07[2] = in_stack_ffffffffffffdb88;
            a_07[3] = in_stack_ffffffffffffdb90;
            b_04[1] = in_stack_ffffffffffffdb60;
            b_04[0] = in_stack_ffffffffffffdb58;
            b_04[2] = in_stack_ffffffffffffdb68;
            b_04[3] = in_stack_ffffffffffffdb70;
            local_15a0 = local_21c0;
            lStack_1598 = lStack_21b8;
            lStack_1590 = lStack_21b0;
            lStack_1588 = lStack_21a8;
            lStack_f48 = lVar124;
            lStack_ec8 = lVar121;
            local_ec0 = local_f80;
            lStack_eb8 = lStack_f78;
            lStack_eb0 = lStack_f70;
            lStack_ea8 = lStack_f68;
            lStack_e88 = lVar123;
            local_e60 = local_f20;
            lStack_e58 = lStack_f18;
            lStack_e50 = lStack_f10;
            lStack_e48 = lStack_f08;
            lStack_e08 = lVar120;
            local_e00 = local_f80;
            lStack_df8 = lStack_f78;
            lStack_df0 = lStack_f70;
            lStack_de8 = lStack_f68;
            lStack_dc8 = lVar122;
            local_da0 = local_f20;
            lStack_d98 = lStack_f18;
            lStack_d90 = lStack_f10;
            lStack_d88 = lStack_f08;
            lStack_d48 = lVar119;
            local_460 = local_2100._0_8_;
            lStack_458 = local_2100._8_8_;
            lStack_450 = local_2100._16_8_;
            lStack_448 = local_2100._24_8_;
            local_440 = local_21c0;
            lStack_438 = lStack_21b8;
            lStack_430 = lStack_21b0;
            lStack_428 = lStack_21a8;
            lStack_408 = lVar72;
            local_400 = local_21c0;
            lStack_3f8 = lStack_21b8;
            lStack_3f0 = lStack_21b0;
            lStack_3e8 = lStack_21a8;
            _mm256_min_epi64_rpl(a_07,b_04);
            a_08[1] = in_stack_ffffffffffffdb80;
            a_08[0] = in_stack_ffffffffffffdb78;
            a_08[2] = in_stack_ffffffffffffdb88;
            a_08[3] = in_stack_ffffffffffffdb90;
            b_05[1] = in_stack_ffffffffffffdb60;
            b_05[0] = in_stack_ffffffffffffdb58;
            b_05[2] = in_stack_ffffffffffffdb68;
            b_05[3] = in_stack_ffffffffffffdb70;
            _mm256_max_epi64_rpl(a_08,b_05);
            a_09[1] = in_stack_ffffffffffffdb80;
            a_09[0] = in_stack_ffffffffffffdb78;
            a_09[2] = in_stack_ffffffffffffdb88;
            a_09[3] = in_stack_ffffffffffffdb90;
            b_06[1] = in_stack_ffffffffffffdb60;
            b_06[0] = in_stack_ffffffffffffdb58;
            b_06[2] = in_stack_ffffffffffffdb68;
            b_06[3] = in_stack_ffffffffffffdb70;
            _mm256_max_epi64_rpl(a_09,b_06);
            a_10[1] = in_stack_ffffffffffffdb80;
            a_10[0] = in_stack_ffffffffffffdb78;
            a_10[2] = in_stack_ffffffffffffdb88;
            a_10[3] = in_stack_ffffffffffffdb90;
            b_07[1] = in_stack_ffffffffffffdb60;
            b_07[0] = in_stack_ffffffffffffdb58;
            b_07[2] = in_stack_ffffffffffffdb68;
            b_07[3] = in_stack_ffffffffffffdb70;
            _mm256_max_epi64_rpl(a_10,b_07);
            a_11[1] = in_stack_ffffffffffffdb80;
            a_11[0] = in_stack_ffffffffffffdb78;
            a_11[2] = in_stack_ffffffffffffdb88;
            a_11[3] = in_stack_ffffffffffffdb90;
            b_08[1] = in_stack_ffffffffffffdb60;
            b_08[0] = in_stack_ffffffffffffdb58;
            b_08[2] = in_stack_ffffffffffffdb68;
            b_08[3] = in_stack_ffffffffffffdb70;
            _mm256_max_epi64_rpl(a_11,b_08);
            local_1c80 = local_1c80 + 1;
          }
        }
        local_12a0 = local_1cf0 + local_1cac;
        lVar122 = (*local_12a0)[0];
        lVar123 = (*local_12a0)[1];
        lVar124 = (*local_12a0)[2];
        lStack_2468 = (*local_12a0)[3];
        local_12a8 = local_1cf8 + local_1cac;
        lVar119 = (*local_12a8)[0];
        lVar120 = (*local_12a8)[1];
        lVar121 = (*local_12a8)[2];
        local_1df0 = (*local_12a8)[3];
        local_12b0 = local_1d00 + local_1cac;
        local_24c0 = (*local_12b0)[0];
        lStack_24b8 = (*local_12b0)[1];
        lVar118 = (*local_12b0)[2];
        local_1df8 = (*local_12b0)[3];
        local_12b8 = local_1d08 + local_1cac;
        lVar115 = (*local_12b8)[0];
        lVar116 = (*local_12b8)[1];
        lVar117 = (*local_12b8)[2];
        lStack_24c8 = (*local_12b8)[3];
        for (local_1c88 = 0; local_1c88 < local_1cb0; local_1c88 = local_1c88 + 1) {
          auVar37._8_8_ = lVar123;
          auVar37._0_8_ = lVar122;
          auVar37._16_8_ = lVar124;
          auVar37._24_8_ = lStack_2468;
          auVar74 = ZEXT816(0) << 0x40;
          auVar7 = vpermq_avx2(auVar37,0x90);
          auVar7 = vpblendd_avx2(auVar7,ZEXT1632(auVar74),3);
          lVar122 = auVar7._0_8_;
          lVar123 = auVar7._8_8_;
          lVar124 = auVar7._16_8_;
          lStack_2468 = auVar7._24_8_;
          auVar35._8_8_ = lVar120;
          auVar35._0_8_ = lVar119;
          auVar35._16_8_ = lVar121;
          auVar35._24_8_ = local_1df0;
          auVar7 = vpermq_avx2(auVar35,0x90);
          auVar7 = vpblendd_avx2(auVar7,ZEXT1632(auVar74),3);
          lVar119 = auVar7._0_8_;
          lVar120 = auVar7._8_8_;
          lVar121 = auVar7._16_8_;
          local_1df0 = auVar7._24_8_;
          auVar30._8_8_ = lStack_24b8;
          auVar30._0_8_ = local_24c0;
          auVar30._16_8_ = lVar118;
          auVar30._24_8_ = local_1df8;
          auVar7 = vpermq_avx2(auVar30,0x90);
          auVar7 = vpblendd_avx2(auVar7,ZEXT1632(auVar74),3);
          local_24c0 = auVar7._0_8_;
          lStack_24b8 = auVar7._8_8_;
          lVar118 = auVar7._16_8_;
          local_1df8 = auVar7._24_8_;
          auVar29._8_8_ = lVar116;
          auVar29._0_8_ = lVar115;
          auVar29._16_8_ = lVar117;
          auVar29._24_8_ = lStack_24c8;
          auVar7 = vpermq_avx2(auVar29,0x90);
          auVar7 = vpblendd_avx2(auVar7,ZEXT1632(auVar74),3);
          lVar115 = auVar7._0_8_;
          lVar116 = auVar7._8_8_;
          lVar117 = auVar7._16_8_;
          lStack_24c8 = auVar7._24_8_;
        }
        local_1de8 = lStack_2468;
        local_1e00 = lStack_24c8;
        local_1160 = local_1e20;
        uStack_1158 = uStack_1e18;
        uStack_1150 = uStack_1e10;
        uStack_1148 = uStack_1e08;
        local_1180 = local_1e60;
        uStack_1178 = uStack_1e58;
        uStack_1170 = uStack_1e50;
        uStack_1168 = uStack_1e48;
        auVar53._8_8_ = uStack_1e18;
        auVar53._0_8_ = local_1e20;
        auVar53._16_8_ = uStack_1e10;
        auVar53._24_8_ = uStack_1e08;
        auVar52._8_8_ = uStack_1e58;
        auVar52._0_8_ = local_1e60;
        auVar52._16_8_ = uStack_1e50;
        auVar52._24_8_ = uStack_1e48;
        local_540 = vpcmpgtq_avx2(auVar53,auVar52);
        local_11a0 = local_1e80;
        uStack_1198 = uStack_1e78;
        uStack_1190 = uStack_1e70;
        uStack_1188 = uStack_1e68;
        local_11c0 = local_1e40;
        uStack_11b8 = uStack_1e38;
        uStack_11b0 = uStack_1e30;
        uStack_11a8 = uStack_1e28;
        auVar51._8_8_ = uStack_1e78;
        auVar51._0_8_ = local_1e80;
        auVar51._16_8_ = uStack_1e70;
        auVar51._24_8_ = uStack_1e68;
        auVar50._8_8_ = uStack_1e38;
        auVar50._0_8_ = local_1e40;
        auVar50._16_8_ = uStack_1e30;
        auVar50._24_8_ = uStack_1e28;
        local_560 = vpcmpgtq_avx2(auVar51,auVar50);
        local_320 = vpor_avx2(local_540,local_560);
        if ((((((((((((((((((((((((((((((((local_320 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_320 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_320 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_320 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_320 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_320 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_320 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_320 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_320 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_320 >> 0x4f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_320 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_320 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_320 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (local_320 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             ) || (local_320 >> 0x77 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(local_320 >> 0x7f,0) != '\0') ||
                          (local_320 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_320 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_320 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_320 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_320 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_320 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_320 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_320 >> 0xbf,0) != '\0') ||
                  (local_320 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_320 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_320 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_320 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_320 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_320 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_320 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_320[0x1f] < '\0') {
          local_1ee8->flag = local_1ee8->flag | 0x40;
          local_1de8 = 0;
          local_1df0 = 0;
          local_1df8 = 0;
          local_1e00 = 0;
          local_1c90 = 0;
          local_1c94 = 0;
        }
        local_1ee8->score = (int)local_1de8;
        local_1ee8->end_query = local_1c90;
        local_1ee8->end_ref = local_1c94;
        ((local_1ee8->field_4).stats)->matches = (int)local_1df0;
        ((local_1ee8->field_4).stats)->similar = (int)local_1df8;
        ((local_1ee8->field_4).stats)->length = (int)local_1e00;
        parasail_free(local_1d40);
        parasail_free(local_1d38);
        parasail_free(local_1d30);
        parasail_free(local_1d28);
        parasail_free(local_1d20);
        parasail_free(local_1d18);
        parasail_free(local_1d10);
        parasail_free(local_1d08);
        parasail_free(local_1d00);
        parasail_free(local_1cf8);
        parasail_free(local_1cf0);
        parasail_free(local_1ce8);
        parasail_free(local_1ce0);
        parasail_free(local_1cd8);
        parasail_free(local_1cd0);
        local_1c60 = local_1ee8;
      }
    }
  }
  return local_1c60;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile64.score;
    pvPm = (__m256i*)profile->profile64.matches;
    pvPs = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            vGapperL = _mm256_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHpM = _mm256_slli_si256_rpl(vHpM, 8);
        vHpS = _mm256_slli_si256_rpl(vHpS, 8);
        vHpL = _mm256_slli_si256_rpl(vHpL, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_sub_epi64(vH, vGapO);
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vGapper = _mm256_add_epi64(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vF, vGapper),
                    _mm256_cmpeq_epi64(vF, vGapper));
            vF = _mm256_max_epi64_rpl(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_add_epi64(vHp, vW);
            vHpM = _mm256_add_epi64(vHpM, vWM);
            vHpS = _mm256_add_epi64(vHpS, vWS);
            vHpL = _mm256_add_epi64(vHpL, vOne);
            case1 = _mm256_cmpgt_epi64(vE, vHp);
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHtM = _mm256_slli_si256_rpl(vHtM, 8);
        vHtS = _mm256_slli_si256_rpl(vHtS, 8);
        vHtL = _mm256_slli_si256_rpl(vHtL, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_add_epi64(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi64(vGapper, vF),
                _mm256_cmpeq_epi64(vGapper, vF));
        vF = _mm256_max_epi64_rpl(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 8);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 8);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vFt, vF),
                    _mm256_cmpeq_epi64(vFt, vF));
            vF = _mm256_max_epi64_rpl(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vFM = _mm256_slli_si256_rpl(vFM, 8);
        vFS = _mm256_slli_si256_rpl(vFS, 8);
        vFL = _mm256_slli_si256_rpl(vFL, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi64(vF, vHt);
        vH = _mm256_max_epi64_rpl(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_sub_epi64(vH, vGapO);
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vH = _mm256_max_epi64_rpl(vHp, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            case1 = _mm256_cmpeq_epi64(vH, vHp);
            case2 = _mm256_cmpeq_epi64(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
                vHM = _mm256_slli_si256_rpl(vHM, 8);
                vHS = _mm256_slli_si256_rpl(vHS, 8);
                vHL = _mm256_slli_si256_rpl(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}